

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3243.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamANCF_3243::ComputeInternalJacobianContIntDamping
          (ChElementBeamANCF_3243 *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  ChVectorN<double,_6> *scalar;
  double *scalar_00;
  double *scalar_01;
  double *other;
  double *other_00;
  Matrix<double,__1,__1,_1,__1,__1> *xpr;
  long col;
  long row;
  long row_00;
  long col_00;
  long col_01;
  double *scalar_02;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar1;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar2;
  PointerType pdVar3;
  undefined1 *puVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  LhsNested LVar8;
  ChElementBeamANCF_3243 *pCVar9;
  scalar_constant_op<double> sVar10;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *this_00;
  Scalar *pSVar11;
  Scalar *pSVar12;
  long lVar13;
  double dVar14;
  int i;
  Index IVar15;
  long lVar16;
  double *other_01;
  int i_1;
  long lVar17;
  Scalar SVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint j;
  ChVectorN<double,_(NSF_*_(NSF___1))___2>_conflict ScaledMassMatrix;
  VectorNIP_D0 E_BlockDamping_D0;
  VectorNIP_Dv E_BlockDamping_Dv;
  VectorNIP_D0 SPK2_1_Block_D0;
  VectorNIP_Dv E3_Block_Dv;
  ChMatrixNM<double,_3_*_NSF,_3_*_NIP_Dv> Scaled_Combined_PE_Dv;
  ChMatrixNM<double,_NSF,_3_*_NIP>_conflict S_scaled_SD;
  VectorNIP_Dv SPK2_3_Block_Dv;
  VectorNIP_Dv SPK2_2_Block_Dv;
  VectorNIP_Dv SPK2_1_Block_Dv;
  VectorNIP_Dv E2_Block_Dv;
  VectorNIP_Dv E1_Block_Dv;
  ChMatrixNMc<double,_3_*_NIP,_3> FCscaled;
  VectorNIP_D0 SPK2_3_Block_D0;
  VectorNIP_D0 SPK2_2_Block_D0;
  ChMatrixNMc<double,_3_*_NIP,_6> FC;
  VectorNIP_D0 SPK2_6_Block_D0;
  VectorNIP_D0 SPK2_5_Block_D0;
  VectorNIP_D0 SPK2_4_Block_D0;
  ChMatrixNM<double,_3_*_NSF,_6_*_NIP_D0___3_*_NIP_Dv> DScaled_Combined_PE;
  MatrixNx6 ebar_ebardot;
  ChMatrixNM<double,_3_*_NSF,_6_*_NIP_D0___3_*_NIP_Dv> PE;
  Index local_a1a0;
  undefined1 local_a140 [16];
  LhsNested LStack_a130;
  variable_if_dynamic<long,__1> vStack_a128;
  variable_if_dynamic<long,__1> vStack_a120;
  element_type *peStack_a118;
  variable_if_dynamic<long,__1> vStack_a110;
  variable_if_dynamic<long,__1> vStack_a108;
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_a100;
  RhsNested local_a0f8;
  LhsNested local_a0f0;
  PointerType pdStack_a0e8;
  double dStack_a0e0;
  Matrix<double,__1,__1,_0,__1,__1> *local_a0d8;
  variable_if_dynamic<long,__1> vStack_a0d0;
  variable_if_dynamic<long,__1> vStack_a0c8;
  double dStack_a0c0;
  LhsNested local_a0a8;
  PointerType pdStack_a0a0;
  double dStack_a098;
  Matrix<double,__1,__1,_0,__1,__1> *local_a090;
  variable_if_dynamic<long,__1> vStack_a088;
  variable_if_dynamic<long,__1> vStack_a080;
  double dStack_a078;
  element_type *local_a010;
  ChElementBeamANCF_3243 *local_a008;
  undefined1 local_a000 [16];
  scalar_constant_op<double> sStack_9ff0;
  scalar_constant_op<double> sStack_9fe8;
  variable_if_dynamic<long,__1> vStack_9fe0;
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_9fd8;
  variable_if_dynamic<long,__1> vStack_9fd0;
  variable_if_dynamic<long,__1> vStack_9fc8;
  variable_if_dynamic<long,__1> vStack_9fc0;
  undefined1 local_9f60 [16];
  scalar_constant_op<double> sStack_9f50;
  variable_if_dynamic<long,__1> vStack_9f48;
  variable_if_dynamic<long,__1> vStack_9f40;
  XprTypeNested pMStack_9f38;
  variable_if_dynamic<long,__1> vStack_9f30;
  variable_if_dynamic<long,__1> vStack_9f28;
  double dStack_9f20;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
  *local_9ef0;
  double local_9ee8;
  undefined1 local_9ee0 [16];
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_9ed0;
  variable_if_dynamic<long,__1> vStack_9ec8;
  variable_if_dynamic<long,__1> vStack_9ec0;
  double dStack_9eb8;
  undefined1 local_9eb0 [16];
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_9ea0;
  variable_if_dynamic<long,__1> vStack_9e98;
  variable_if_dynamic<long,__1> vStack_9e90;
  double dStack_9e88;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_9e80 [24];
  double local_9e68;
  PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> local_9e60 [8];
  double local_9e58;
  double local_9e50;
  double local_9e48;
  double local_9e40;
  double local_9e38;
  double local_9e30;
  double local_9e28;
  double local_9e20;
  undefined1 local_9e18 [16];
  scalar_constant_op<double> sStack_9e08;
  variable_if_dynamic<long,__1> vStack_9e00;
  variable_if_dynamic<long,__1> vStack_9df8;
  Matrix<double,__1,__1,_0,__1,__1> *pMStack_9df0;
  undefined1 local_9de0 [96];
  undefined1 local_9d80 [16];
  scalar_constant_op<double> sStack_9d70;
  scalar_constant_op<double> sStack_9d68;
  variable_if_dynamic<long,__1> vStack_9d60;
  double dStack_9d58;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_9d18 [24];
  undefined1 local_9d00 [48];
  variable_if_dynamic<long,__1> vStack_9cd0;
  variable_if_dynamic<long,__1> vStack_9cc8;
  undefined1 *puStack_9cc0;
  undefined1 *local_9cb8;
  double dStack_9cb0;
  double local_9ca8;
  double local_9ca0;
  PointerType pdStack_9c90;
  double dStack_9c88;
  XprTypeNested local_9c80;
  double dStack_9c78;
  double dStack_9c70;
  XprTypeNested pMStack_9c68;
  undefined1 *local_9c60;
  undefined1 *local_9c50;
  double local_9c48;
  double local_9c40;
  double local_9c38;
  Matrix<double,_8,_45,_1,_8,_45> local_9640;
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_8ad0 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_8ab8 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_8aa0 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_8a88 [24];
  PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> local_8a70 [24];
  undefined1 local_8a58 [1080];
  Matrix<double,_12,_1,_0,_12,_1> local_8620;
  Matrix<double,_12,_1,_0,_12,_1> local_85c0;
  undefined1 local_8550 [192];
  undefined1 local_8490 [888];
  undefined1 local_8118 [192];
  undefined1 local_8058 [96];
  undefined1 local_7ff8 [24];
  undefined1 local_7fe0 [24];
  undefined1 local_7fc8 [24];
  undefined1 local_7fb0 [96];
  undefined1 local_7f50 [96];
  undefined1 local_7ef0 [96];
  undefined1 local_7e90 [24];
  undefined1 local_7e78 [24];
  undefined1 local_7e60 [24];
  undefined1 local_7e48 [96];
  undefined1 local_7de8 [96];
  undefined1 local_7d88 [96];
  undefined1 local_7d28 [24];
  undefined1 local_7d10 [24];
  undefined1 local_7cf8 [24];
  undefined1 local_7ce0 [96];
  undefined1 local_7c80 [96];
  Matrix<double,_12,_1,_0,_12,_1> local_7c20;
  Block<Eigen::Matrix<double,_8,_45,_1,_8,_45>,_1,_12,_false> local_7bb0;
  Matrix<double,_24,_81,_1,_24,_81> local_7b80;
  MatrixBase<Eigen::Matrix<double,_8,_6,_1,_8,_6>_> local_3ec0 [384];
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,_8,_6,_1,_8,_6>,_0>
  local_3d40;
  
  local_9ef0 = (DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                *)H;
  local_9ee8 = Kfactor;
  local_9e68 = Mfactor;
  CalcCombinedCoordMatrix(this,(MatrixNx6 *)local_3ec0);
  xpr = &this->m_SD;
  local_a008 = this;
  local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.array
  [0] = (double)xpr;
  local_3d40 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::operator*
                         ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>> *)
                          &local_7b80,local_3ec0);
  Eigen::PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>>::
  PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Matrix<double,8,6,1,8,6>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,45,6,0,45,6>> *)local_8550,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,_8,_6,_1,_8,_6>,_0>_>
              *)&local_3d40);
  IVar15 = 0;
  for (lVar13 = 0; dVar14 = local_9ee8, pCVar9 = local_a008, lVar13 != 8; lVar13 = lVar13 + 1) {
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_9640,xpr,
               lVar13,0);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = SUB168(ZEXT816(0),4);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage
               .m_data.array[6];
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,IVar15,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_9640,xpr,
               lVar13,0xc);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)(local_8550 + 0x60);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 5.92878775009496e-323;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = (double)local_8550;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,IVar15,0xc);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_9640,xpr,
               lVar13,0x18);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)local_8490;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 1.18575755001899e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = (double)local_8550;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,IVar15,0x18);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9d00,xpr,
               lVar13,0x18);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)local_9d00._32_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)local_9d00._40_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_9d00._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_9d00._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)local_9d00._16_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)local_9d00._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_8a58,xpr,
               lVar13,0xc);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[7] = (double)(local_8550 + 0x60);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_8a58._32_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_8a58._40_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 5.92878775009496e-323;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x14] = (double)local_8490;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x17] = 1.18575755001899e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x18] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x16] = local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,IVar15,0x24);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9d00,xpr,
               lVar13,0x18);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)local_9d00._32_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)local_9d00._40_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_9d00._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_9d00._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)local_9d00._16_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)local_9d00._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_8a58,xpr,
               lVar13,0);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[7] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_8a58._32_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_8a58._40_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = SUB168(ZEXT816(0),4);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x14] = (double)local_8490;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x17] = 1.18575755001899e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x18] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage
               .m_data.array[7];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x16] = local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.
                  m_storage.m_data.array[7];
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,IVar15,0x30);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9d00,xpr,
               lVar13,0xc);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)local_9d00._32_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)local_9d00._40_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_9d00._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_9d00._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)local_9d00._16_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)local_9d00._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_8a58,xpr,
               lVar13,0);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[7] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_8a58._32_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_8a58._40_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = SUB168(ZEXT816(0),4);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x14] = (double)(local_8550 + 0x60);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x17] = 5.92878775009496e-323;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x18] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage
               .m_data.array[7];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x16] = local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.
                  m_storage.m_data.array[7];
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,IVar15,0x3c);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_9640,xpr,
               lVar13,0x24);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)(local_8490 + 0x60);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 1.77863632502849e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,IVar15,0x48);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_9640,xpr,
               lVar13,0x27);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)(local_8490 + 0x78);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 1.92685601878086e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = (double)local_8550;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,IVar15,0x4b);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_9640,xpr,
               lVar13,0x2a);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)(local_8490 + 0x90);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 2.07507571253324e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = (double)local_8550;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,IVar15,0x4e);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_9640,xpr,
               lVar13,0);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)(local_8490 + 0xa8);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    lVar17 = IVar15 + 1;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = (double)local_8550;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_9640,xpr,
               lVar13,0xc);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)(local_8490 + 0x108);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 5.92878775009496e-323;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0xc);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_9640,xpr,
               lVar13,0x18);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)(local_8490 + 0x168);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 1.18575755001899e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0x18);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9d00,xpr,
               lVar13,0x18);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)local_9d00._32_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)local_9d00._40_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_9d00._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_9d00._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)local_9d00._16_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)local_9d00._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_8a58,xpr,
               lVar13,0xc);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[7] = (double)(local_8490 + 0x108);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_8a58._32_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_8a58._40_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 5.92878775009496e-323;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 4.94065645841247e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x14] = (double)(local_8490 + 0x168);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x17] = 1.18575755001899e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x18] = 4.94065645841247e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x16] = local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0x24);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9d00,xpr,
               lVar13,0x18);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)local_9d00._32_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)local_9d00._40_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_9d00._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_9d00._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)local_9d00._16_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)local_9d00._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_8a58,xpr,
               lVar13,0);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[7] = (double)(local_8490 + 0xa8);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_8a58._32_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_8a58._40_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 4.94065645841247e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x14] = (double)(local_8490 + 0x168);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x17] = 1.18575755001899e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x18] = 4.94065645841247e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x16] = local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0x30);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9d00,xpr,
               lVar13,0xc);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)local_9d00._32_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)local_9d00._40_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_9d00._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_9d00._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)local_9d00._16_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)local_9d00._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_8a58,xpr,
               lVar13,0);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[7] = (double)(local_8490 + 0xa8);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_8a58._32_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_8a58._40_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 4.94065645841247e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x14] = (double)(local_8490 + 0x108);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x17] = 5.92878775009496e-323;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x18] = 4.94065645841247e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x16] = local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0x3c);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_9640,xpr,
               lVar13,0x24);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)(local_8490 + 0x1c8);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 1.77863632502849e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0x48);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_9640,xpr,
               lVar13,0x27);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)(local_8490 + 0x1e0);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 1.92685601878086e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0x4b);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_9640,xpr,
               lVar13,0x2a);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)(local_8490 + 0x1f8);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 2.07507571253324e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 4.94065645841247e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0x4e);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_9640,xpr,
               lVar13,0);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)(local_8490 + 0x210);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    lVar17 = IVar15 + 2;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_9640,xpr,
               lVar13,0xc);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)(local_8490 + 0x270);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 5.92878775009496e-323;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0xc);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)&local_9640,xpr,
               lVar13,0x18);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)(local_8490 + 0x2d0);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 1.18575755001899e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0x18);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9d00,xpr,
               lVar13,0x18);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)local_9d00._32_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)local_9d00._40_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_9d00._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_9d00._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)local_9d00._16_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)local_9d00._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_8a58,xpr,
               lVar13,0xc);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[7] = (double)(local_8490 + 0x270);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_8a58._32_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_8a58._40_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 5.92878775009496e-323;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 9.88131291682493e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x14] = (double)(local_8490 + 0x2d0);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x17] = 1.18575755001899e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x18] = 9.88131291682493e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x16] = local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.
                  m_storage.m_data.array[9];
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0x24);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9d00,xpr,
               lVar13,0x18);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)local_9d00._32_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)local_9d00._40_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_9d00._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_9d00._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)local_9d00._16_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)local_9d00._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_8a58,xpr,
               lVar13,0);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[7] = (double)(local_8490 + 0x210);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_8a58._32_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_8a58._40_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 9.88131291682493e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x14] = (double)(local_8490 + 0x2d0);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x17] = 1.18575755001899e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x18] = 9.88131291682493e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x16] = (double)local_8550;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0x30);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9d00,xpr,
               lVar13,0xc);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)local_9d00._32_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)local_9d00._40_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_9d00._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_9d00._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)local_9d00._16_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)local_9d00._24_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_8a58,xpr,
               lVar13,0);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[7] = (double)(local_8490 + 0x210);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x12] = (double)local_8a58._32_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x13] = (double)local_8a58._40_8_;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 0.0;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 9.88131291682493e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x14] = (double)(local_8490 + 0x270);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xc] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x17] = 5.92878775009496e-323;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x18] = 9.88131291682493e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x19] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = (double)local_8550;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0x16] = (double)local_8550;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0x3c);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a140,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_9640,xpr,
               lVar13,0x24);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)(local_8490 + 0x330);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 1.77863632502849e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = (double)local_8550;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0x48);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_9640,xpr,
               lVar13,0x27);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)(local_8490 + 0x348);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 1.92685601878086e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = (double)local_8550;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0x4b);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_7b80);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)&local_9640,xpr,
               lVar13,0x2a);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[6] = (double)(local_8490 + 0x360);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[9] = 2.07507571253324e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[10] = 9.88131291682493e-324;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0xb] = 2.22329540628561e-322;
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[8] = (double)local_8550;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (Matrix<double,_24,_81,_1,_24,_81> *)&local_3d40,lVar17,0x4e);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_3,_false> *)local_9d00,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>
                *)&local_7b80);
    IVar15 = IVar15 + 3;
  }
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_9ee8;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = Rfactor;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_a008->m_Alpha;
  auVar6 = vfmadd132sd_fma(auVar19,auVar20,auVar6);
  scalar_02 = &local_a008->m_Alpha;
  local_9f60._0_8_ = auVar6._0_8_;
  vStack_a128.m_value = 0;
  vStack_a120.m_value = 0;
  peStack_a118 = (element_type *)0x2d;
  local_a140._0_8_ = (element_type *)local_8550;
  LStack_a130.m_matrix = (non_const_type)local_8550;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_45,_3,_0,_45,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_45,_3,_false>_>
                    *)&local_9640,(double *)local_9f60,(StorageBaseType *)local_a140);
  local_a000._0_8_ = local_8118;
  local_9de0._0_8_ = dVar14 * pCVar9->m_Alpha;
  sStack_9fe8.m_other = 0.0;
  vStack_9fe0.m_value = 3;
  pMStack_9fd8 = (Matrix<double,__1,__1,_0,__1,__1> *)0x2d;
  sStack_9ff0.m_other = (double)local_8550;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_45,_3,_0,_45,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_45,_3,_false>_>
                    *)local_9d00,(double *)local_9de0,(StorageBaseType *)local_a000);
  local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.array
  [3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.
        array[2];
  local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.array
  [4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.
        array[3];
  local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.array
  [5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.
        array[4];
  local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.array
  [6] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.
        array[5];
  local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.array
  [7] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.
        array[6];
  local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.array
  [8] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.
        array[7];
  local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.array
  [9] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.
        array[8];
  local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.array
  [0xd] = (double)local_9d00._16_8_;
  local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.array
  [0x12] = (double)vStack_9cc8.m_value;
  local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.array
  [0x13] = (double)puStack_9cc0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,45,3,0,45,3>const>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,45,3,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,45,3,0,45,3>const>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,45,3,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,45,3,0,45,3>> *)local_8a58,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_45,_3,_0,_45,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_45,_3,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_45,_3,_0,_45,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_45,_3,_false>_>_>_>
              *)&local_7b80);
  pMVar1 = &pCVar9->m_kGQ_D0;
  pMVar2 = &pCVar9->m_kGQ_Dv;
  lVar13 = 0;
  while( true ) {
    if (lVar13 == 3) break;
    local_9d00._0_8_ = pMVar1;
    Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)&local_9640,
               (Matrix<double,_45,_3,_0,_45,_3> *)local_8a58,0,lVar13);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>>::
    operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>>
                *)&local_7b80,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               local_9d00);
    local_9d00._0_8_ = pMVar1;
    Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)&local_9640,
               (Matrix<double,_45,_3,_0,_45,_3> *)local_8a58,0xc,lVar13);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>>::
    operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>>
                *)&local_7b80,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               local_9d00);
    local_9d00._0_8_ = pMVar1;
    Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false> *)&local_9640,
               (Matrix<double,_45,_3,_0,_45,_3> *)local_8a58,0x18,lVar13);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    Eigen::
    ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>>::
    operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>>
                *)&local_7b80,
               (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
               local_9d00);
    local_9d00._0_8_ = pMVar2;
    Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)&local_9640,
               (Matrix<double,_45,_3,_0,_45,_3> *)local_8a58,0x24,lVar13);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>>
    ::operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>>
                  *)&local_7b80,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                 local_9d00);
    local_9d00._0_8_ = pMVar2;
    Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)&local_9640,
               (Matrix<double,_45,_3,_0,_45,_3> *)local_8a58,0x27,lVar13);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>>
    ::operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>>
                  *)&local_7b80,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                 local_9d00);
    local_9d00._0_8_ = pMVar2;
    Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>::Block
              ((Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false> *)&local_9640,
               (Matrix<double,_45,_3,_0,_45,_3> *)local_8a58,0x2a,lVar13);
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[4] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[4];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[5] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[5];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[0] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[0];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[1] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[1];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[2] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[2];
    local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
    array[3] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
               m_data.array[3];
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>>
    ::operator*=((ArrayBase<Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>>
                  *)&local_7b80,
                 (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
                 local_9d00);
    lVar13 = lVar13 + 1;
  }
  local_a010 = (element_type *)&local_a008->m_material;
  std::__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *)
             &local_7b80,
             (__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *)local_a010
            );
  dVar14 = local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.
           m_data.array[0];
  scalar = (ChVectorN<double,_6> *)
           ((long)local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.
                  m_storage.m_data.array[0] + 0x10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.
              m_data.array + 1));
  scalar_00 = (((ChVectorN<double,_6> *)((long)dVar14 + 0x10))->
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array +
              2;
  scalar_01 = (((ChVectorN<double,_6> *)((long)dVar14 + 0x10))->
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array +
              1;
  other = (((ChVectorN<double,_6> *)((long)dVar14 + 0x10))->
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array + 3;
  IVar15 = 0;
  lVar13 = 0;
  other_00 = (((ChVectorN<double,_6> *)((long)dVar14 + 0x10))->
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array +
             4;
  other_01 = (((ChVectorN<double,_6> *)((long)dVar14 + 0x10))->
             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array +
             5;
  while( true ) {
    if (lVar13 == 8) break;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a140,xpr,
               lVar13,0);
    auVar7 = stack0xffffffffffff6318;
    puStack_9cc0 = local_8a58;
    local_9d00._32_8_ = vStack_a120.m_value;
    local_9d00._24_8_ = vStack_a128.m_value;
    vStack_9cd0.m_value = auVar7._24_8_;
    local_9d00._40_8_ = peStack_a118;
    local_9d00._0_8_ = local_a140._0_8_;
    local_9d00._8_8_ = local_a140._8_8_;
    local_9d00._16_8_ = LStack_a130.m_matrix;
    local_9cb8 = (undefined1 *)0x0;
    dStack_9cb0 = SUB168(ZEXT816(0),4);
    local_9ca8 = 2.22329540628561e-322;
    vStack_9cd0.m_value = (long)puStack_9cc0;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_9640,(double *)scalar,(StorageBaseType *)local_9d00);
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               &local_7b80,IVar15,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a140,xpr,
               lVar13,0xc);
    local_9d00._32_8_ = vStack_a120.m_value;
    local_9d00._24_8_ = vStack_a128.m_value;
    local_9d00._40_8_ = peStack_a118;
    local_9d00._0_8_ = local_a140._0_8_;
    local_9d00._8_8_ = local_a140._8_8_;
    local_9d00._16_8_ = LStack_a130.m_matrix;
    local_9cb8 = (undefined1 *)0xc;
    dStack_9cb0 = 0.0;
    local_9ca8 = 2.22329540628561e-322;
    puStack_9cc0 = local_8a58;
    vStack_9cd0.m_value = (long)(local_8a58 + 0x60);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_9640,scalar_01,(StorageBaseType *)local_9d00);
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               &local_7b80,IVar15,0xc);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a140,xpr,
               lVar13,0x18);
    local_9d00._32_8_ = vStack_a120.m_value;
    local_9d00._24_8_ = vStack_a128.m_value;
    local_9d00._40_8_ = peStack_a118;
    local_9d00._0_8_ = local_a140._0_8_;
    local_9d00._8_8_ = local_a140._8_8_;
    local_9d00._16_8_ = LStack_a130.m_matrix;
    vStack_9cd0.m_value = (long)(local_8a58 + 0xc0);
    local_9cb8 = (undefined1 *)0x18;
    dStack_9cb0 = 0.0;
    local_9ca8 = 2.22329540628561e-322;
    puStack_9cc0 = local_8a58;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_9640,scalar_00,(StorageBaseType *)local_9d00);
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               &local_7b80,IVar15,0x18);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a000,xpr,
               lVar13,0x18);
    vStack_a120.m_value = vStack_9fe0.m_value;
    peStack_a118 = (element_type *)pMStack_9fd8;
    local_a140._0_8_ = local_a000._0_8_;
    local_a140._8_8_ = local_a000._8_8_;
    LStack_a130.m_matrix = (non_const_type)sStack_9ff0.m_other;
    vStack_a128.m_value = (long)sStack_9fe8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9f60,xpr,
               lVar13,0xc);
    vStack_9cc8.m_value = (long)(local_8a58 + 0x60);
    dStack_9c70 = (double)vStack_9f40.m_value;
    pMStack_9c68 = pMStack_9f38;
    pdStack_9c90 = (PointerType)local_9f60._0_8_;
    dStack_9c88 = (double)local_9f60._8_8_;
    local_9c80 = (XprTypeNested)sStack_9f50.m_other;
    dStack_9c78 = (double)vStack_9f48.m_value;
    local_9d00._32_8_ = vStack_a128.m_value;
    local_9d00._24_8_ = LStack_a130.m_matrix;
    local_9d00._40_8_ = vStack_a120.m_value;
    vStack_9cd0.m_value = (long)peStack_a118;
    local_9d00._8_8_ = local_a140._0_8_;
    local_9d00._16_8_ = local_a140._8_8_;
    local_9cb8 = local_8a58;
    dStack_9cb0 = 5.92878775009496e-323;
    local_9ca8 = 0.0;
    local_9c60 = local_8a58 + 0xc0;
    local_9ca0 = 2.22329540628561e-322;
    local_9c48 = 1.18575755001899e-322;
    local_9c40 = 0.0;
    local_9c38 = 2.22329540628561e-322;
    local_9c50 = local_9cb8;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_9640,other,(StorageBaseType *)local_9d00);
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               &local_7b80,IVar15,0x24);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a000,xpr,
               lVar13,0x18);
    vStack_a120.m_value = vStack_9fe0.m_value;
    peStack_a118 = (element_type *)pMStack_9fd8;
    local_a140._0_8_ = local_a000._0_8_;
    local_a140._8_8_ = local_a000._8_8_;
    LStack_a130.m_matrix = (non_const_type)sStack_9ff0.m_other;
    vStack_a128.m_value = (long)sStack_9fe8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9f60,xpr,
               lVar13,0);
    vStack_9cc8.m_value = (long)local_8a58;
    dStack_9c70 = (double)vStack_9f40.m_value;
    pMStack_9c68 = pMStack_9f38;
    pdStack_9c90 = (PointerType)local_9f60._0_8_;
    dStack_9c88 = (double)local_9f60._8_8_;
    local_9c80 = (XprTypeNested)sStack_9f50.m_other;
    dStack_9c78 = (double)vStack_9f48.m_value;
    local_9d00._32_8_ = vStack_a128.m_value;
    local_9d00._24_8_ = LStack_a130.m_matrix;
    local_9d00._40_8_ = vStack_a120.m_value;
    vStack_9cd0.m_value = (long)peStack_a118;
    local_9d00._8_8_ = local_a140._0_8_;
    local_9d00._16_8_ = local_a140._8_8_;
    dStack_9cb0 = 0.0;
    local_9ca8 = SUB168(ZEXT816(0),4);
    local_9c60 = local_8a58 + 0xc0;
    local_9ca0 = 2.22329540628561e-322;
    local_9c48 = 1.18575755001899e-322;
    local_9c40 = 0.0;
    local_9c38 = 2.22329540628561e-322;
    local_9cb8 = (undefined1 *)vStack_9cc8.m_value;
    local_9c50 = (undefined1 *)vStack_9cc8.m_value;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_9640,other_00,(StorageBaseType *)local_9d00);
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               &local_7b80,IVar15,0x30);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a000,xpr,
               lVar13,0xc);
    vStack_a120.m_value = vStack_9fe0.m_value;
    peStack_a118 = (element_type *)pMStack_9fd8;
    local_a140._0_8_ = local_a000._0_8_;
    local_a140._8_8_ = local_a000._8_8_;
    LStack_a130.m_matrix = (non_const_type)sStack_9ff0.m_other;
    vStack_a128.m_value = (long)sStack_9fe8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9f60,xpr,
               lVar13,0);
    local_9c60 = local_8a58 + 0x60;
    dStack_9c70 = (double)vStack_9f40.m_value;
    pMStack_9c68 = pMStack_9f38;
    pdStack_9c90 = (PointerType)local_9f60._0_8_;
    dStack_9c88 = (double)local_9f60._8_8_;
    local_9c80 = (XprTypeNested)sStack_9f50.m_other;
    dStack_9c78 = (double)vStack_9f48.m_value;
    local_9d00._32_8_ = vStack_a128.m_value;
    local_9d00._24_8_ = LStack_a130.m_matrix;
    local_9d00._40_8_ = vStack_a120.m_value;
    vStack_9cd0.m_value = (long)peStack_a118;
    local_9d00._8_8_ = local_a140._0_8_;
    local_9d00._16_8_ = local_a140._8_8_;
    dStack_9cb0 = 0.0;
    local_9ca8 = SUB168(ZEXT816(0),4);
    local_9ca0 = 2.22329540628561e-322;
    local_9c48 = 5.92878775009496e-323;
    local_9c40 = 0.0;
    local_9c38 = 2.22329540628561e-322;
    vStack_9cc8.m_value = (long)local_8a58;
    local_9cb8 = local_8a58;
    local_9c50 = local_8a58;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_9640,other_01,(StorageBaseType *)local_9d00);
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               &local_7b80,IVar15,0x3c);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a140,xpr,
               lVar13,0);
    auVar7 = stack0xffffffffffff6318;
    local_9d00._32_8_ = vStack_a120.m_value;
    local_9d00._24_8_ = vStack_a128.m_value;
    vStack_9cd0.m_value = auVar7._24_8_;
    local_9d00._40_8_ = peStack_a118;
    local_9d00._0_8_ = local_a140._0_8_;
    local_9d00._8_8_ = local_a140._8_8_;
    local_9d00._16_8_ = LStack_a130.m_matrix;
    local_9cb8 = (undefined1 *)0x0;
    dStack_9cb0 = 4.94065645841247e-324;
    local_9ca8 = 2.22329540628561e-322;
    puStack_9cc0 = local_8a58;
    vStack_9cd0.m_value = (long)(local_8a58 + 0x168);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_9640,(double *)scalar,(StorageBaseType *)local_9d00);
    lVar17 = IVar15 + 1;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               &local_7b80,lVar17,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a140,xpr,
               lVar13,0xc);
    puStack_9cc0 = local_8a58;
    local_9d00._32_8_ = vStack_a120.m_value;
    local_9d00._24_8_ = vStack_a128.m_value;
    local_9d00._40_8_ = peStack_a118;
    local_9d00._0_8_ = local_a140._0_8_;
    local_9d00._8_8_ = local_a140._8_8_;
    local_9d00._16_8_ = LStack_a130.m_matrix;
    local_9cb8 = (undefined1 *)0xc;
    dStack_9cb0 = 4.94065645841247e-324;
    local_9ca8 = 2.22329540628561e-322;
    vStack_9cd0.m_value = (long)(local_8a58 + 0x1c8);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_9640,scalar_01,(StorageBaseType *)local_9d00);
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               &local_7b80,lVar17,0xc);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a140,xpr,
               lVar13,0x18);
    puStack_9cc0 = local_8a58;
    local_9d00._32_8_ = vStack_a120.m_value;
    local_9d00._24_8_ = vStack_a128.m_value;
    local_9d00._40_8_ = peStack_a118;
    local_9d00._0_8_ = local_a140._0_8_;
    local_9d00._8_8_ = local_a140._8_8_;
    local_9d00._16_8_ = LStack_a130.m_matrix;
    vStack_9cd0.m_value = (long)(local_8a58 + 0x228);
    local_9cb8 = (undefined1 *)0x18;
    dStack_9cb0 = 4.94065645841247e-324;
    local_9ca8 = 2.22329540628561e-322;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_9640,scalar_00,(StorageBaseType *)local_9d00);
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               &local_7b80,lVar17,0x18);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a000,xpr,
               lVar13,0x18);
    vStack_a120.m_value = vStack_9fe0.m_value;
    peStack_a118 = (element_type *)pMStack_9fd8;
    local_a140._0_8_ = local_a000._0_8_;
    local_a140._8_8_ = local_a000._8_8_;
    LStack_a130.m_matrix = (non_const_type)sStack_9ff0.m_other;
    vStack_a128.m_value = (long)sStack_9fe8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9f60,xpr,
               lVar13,0xc);
    vStack_9cc8.m_value = (long)(local_8a58 + 0x1c8);
    dStack_9c70 = (double)vStack_9f40.m_value;
    pMStack_9c68 = pMStack_9f38;
    pdStack_9c90 = (PointerType)local_9f60._0_8_;
    dStack_9c88 = (double)local_9f60._8_8_;
    local_9c80 = (XprTypeNested)sStack_9f50.m_other;
    dStack_9c78 = (double)vStack_9f48.m_value;
    local_9d00._32_8_ = vStack_a128.m_value;
    local_9d00._24_8_ = LStack_a130.m_matrix;
    local_9d00._40_8_ = vStack_a120.m_value;
    vStack_9cd0.m_value = (long)peStack_a118;
    local_9d00._8_8_ = local_a140._0_8_;
    local_9d00._16_8_ = local_a140._8_8_;
    local_9cb8 = local_8a58;
    dStack_9cb0 = 5.92878775009496e-323;
    local_9ca8 = 4.94065645841247e-324;
    local_9c60 = local_8a58 + 0x228;
    local_9ca0 = 2.22329540628561e-322;
    local_9c48 = 1.18575755001899e-322;
    local_9c40 = 4.94065645841247e-324;
    local_9c38 = 2.22329540628561e-322;
    local_9c50 = local_9cb8;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_9640,other,(StorageBaseType *)local_9d00);
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               &local_7b80,lVar17,0x24);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a000,xpr,
               lVar13,0x18);
    vStack_a120.m_value = vStack_9fe0.m_value;
    peStack_a118 = (element_type *)pMStack_9fd8;
    local_a140._0_8_ = local_a000._0_8_;
    local_a140._8_8_ = local_a000._8_8_;
    LStack_a130.m_matrix = (non_const_type)sStack_9ff0.m_other;
    vStack_a128.m_value = (long)sStack_9fe8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9f60,xpr,
               lVar13,0);
    vStack_9cc8.m_value = (long)(local_8a58 + 0x168);
    dStack_9c70 = (double)vStack_9f40.m_value;
    pMStack_9c68 = pMStack_9f38;
    pdStack_9c90 = (PointerType)local_9f60._0_8_;
    dStack_9c88 = (double)local_9f60._8_8_;
    local_9c80 = (XprTypeNested)sStack_9f50.m_other;
    dStack_9c78 = (double)vStack_9f48.m_value;
    local_9d00._32_8_ = vStack_a128.m_value;
    local_9d00._24_8_ = LStack_a130.m_matrix;
    local_9d00._40_8_ = vStack_a120.m_value;
    vStack_9cd0.m_value = (long)peStack_a118;
    local_9d00._8_8_ = local_a140._0_8_;
    local_9d00._16_8_ = local_a140._8_8_;
    local_9cb8 = local_8a58;
    dStack_9cb0 = 0.0;
    local_9ca8 = 4.94065645841247e-324;
    local_9c60 = local_8a58 + 0x228;
    local_9ca0 = 2.22329540628561e-322;
    local_9c48 = 1.18575755001899e-322;
    local_9c40 = 4.94065645841247e-324;
    local_9c38 = 2.22329540628561e-322;
    local_9c50 = local_9cb8;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_9640,other_00,(StorageBaseType *)local_9d00);
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               &local_7b80,lVar17,0x30);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a000,xpr,
               lVar13,0xc);
    vStack_a120.m_value = vStack_9fe0.m_value;
    peStack_a118 = (element_type *)pMStack_9fd8;
    local_a140._0_8_ = local_a000._0_8_;
    local_a140._8_8_ = local_a000._8_8_;
    LStack_a130.m_matrix = (non_const_type)sStack_9ff0.m_other;
    vStack_a128.m_value = (long)sStack_9fe8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9f60,xpr,
               lVar13,0);
    vStack_9cc8.m_value = (long)(local_8a58 + 0x168);
    dStack_9c70 = (double)vStack_9f40.m_value;
    pMStack_9c68 = pMStack_9f38;
    pdStack_9c90 = (PointerType)local_9f60._0_8_;
    dStack_9c88 = (double)local_9f60._8_8_;
    local_9c80 = (XprTypeNested)sStack_9f50.m_other;
    dStack_9c78 = (double)vStack_9f48.m_value;
    local_9d00._32_8_ = vStack_a128.m_value;
    local_9d00._24_8_ = LStack_a130.m_matrix;
    local_9d00._40_8_ = vStack_a120.m_value;
    vStack_9cd0.m_value = (long)peStack_a118;
    local_9d00._8_8_ = local_a140._0_8_;
    local_9d00._16_8_ = local_a140._8_8_;
    local_9cb8 = local_8a58;
    dStack_9cb0 = 0.0;
    local_9ca8 = 4.94065645841247e-324;
    local_9c60 = local_8a58 + 0x1c8;
    local_9ca0 = 2.22329540628561e-322;
    local_9c48 = 5.92878775009496e-323;
    local_9c40 = 4.94065645841247e-324;
    local_9c38 = 2.22329540628561e-322;
    local_9c50 = local_9cb8;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_9640,other_01,(StorageBaseType *)local_9d00);
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               &local_7b80,lVar17,0x3c);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a140,xpr,
               lVar13,0);
    auVar7 = stack0xffffffffffff6318;
    local_9d00._32_8_ = vStack_a120.m_value;
    local_9d00._24_8_ = vStack_a128.m_value;
    vStack_9cd0.m_value = auVar7._24_8_;
    local_9d00._40_8_ = peStack_a118;
    local_9d00._0_8_ = local_a140._0_8_;
    local_9d00._8_8_ = local_a140._8_8_;
    local_9d00._16_8_ = LStack_a130.m_matrix;
    local_9cb8 = (undefined1 *)0x0;
    dStack_9cb0 = 9.88131291682493e-324;
    local_9ca8 = 2.22329540628561e-322;
    puStack_9cc0 = local_8a58;
    vStack_9cd0.m_value = (long)(local_8a58 + 0x2d0);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_9640,(double *)scalar,(StorageBaseType *)local_9d00);
    lVar17 = IVar15 + 2;
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               &local_7b80,lVar17,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a140,xpr,
               lVar13,0xc);
    local_9d00._32_8_ = vStack_a120.m_value;
    local_9d00._24_8_ = vStack_a128.m_value;
    local_9d00._40_8_ = peStack_a118;
    local_9d00._0_8_ = local_a140._0_8_;
    local_9d00._8_8_ = local_a140._8_8_;
    local_9d00._16_8_ = LStack_a130.m_matrix;
    local_9cb8 = (undefined1 *)0xc;
    dStack_9cb0 = 9.88131291682493e-324;
    local_9ca8 = 2.22329540628561e-322;
    puStack_9cc0 = local_8a58;
    vStack_9cd0.m_value = (long)(local_8a58 + 0x330);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_9640,scalar_01,(StorageBaseType *)local_9d00);
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               &local_7b80,lVar17,0xc);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a140,xpr,
               lVar13,0x18);
    puStack_9cc0 = local_8a58;
    local_9d00._32_8_ = vStack_a120.m_value;
    local_9d00._24_8_ = vStack_a128.m_value;
    local_9d00._40_8_ = peStack_a118;
    local_9d00._0_8_ = local_a140._0_8_;
    local_9d00._8_8_ = local_a140._8_8_;
    local_9d00._16_8_ = LStack_a130.m_matrix;
    vStack_9cd0.m_value = (long)(local_8a58 + 0x390);
    local_9cb8 = (undefined1 *)0x18;
    dStack_9cb0 = 9.88131291682493e-324;
    local_9ca8 = 2.22329540628561e-322;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                      *)&local_9640,scalar_00,(StorageBaseType *)local_9d00);
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               &local_7b80,lVar17,0x18);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a000,xpr,
               lVar13,0x18);
    vStack_a120.m_value = vStack_9fe0.m_value;
    peStack_a118 = (element_type *)pMStack_9fd8;
    local_a140._0_8_ = local_a000._0_8_;
    local_a140._8_8_ = local_a000._8_8_;
    LStack_a130.m_matrix = (non_const_type)sStack_9ff0.m_other;
    vStack_a128.m_value = (long)sStack_9fe8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9f60,xpr,
               lVar13,0xc);
    vStack_9cc8.m_value = (long)(local_8a58 + 0x330);
    dStack_9c70 = (double)vStack_9f40.m_value;
    pMStack_9c68 = pMStack_9f38;
    pdStack_9c90 = (PointerType)local_9f60._0_8_;
    dStack_9c88 = (double)local_9f60._8_8_;
    local_9c80 = (XprTypeNested)sStack_9f50.m_other;
    dStack_9c78 = (double)vStack_9f48.m_value;
    local_9d00._32_8_ = vStack_a128.m_value;
    local_9d00._24_8_ = LStack_a130.m_matrix;
    local_9d00._40_8_ = vStack_a120.m_value;
    vStack_9cd0.m_value = (long)peStack_a118;
    local_9d00._8_8_ = local_a140._0_8_;
    local_9d00._16_8_ = local_a140._8_8_;
    local_9cb8 = local_8a58;
    dStack_9cb0 = 5.92878775009496e-323;
    local_9ca8 = 9.88131291682493e-324;
    local_9c60 = local_8a58 + 0x390;
    local_9ca0 = 2.22329540628561e-322;
    local_9c48 = 1.18575755001899e-322;
    local_9c40 = 9.88131291682493e-324;
    local_9c38 = 2.22329540628561e-322;
    local_9c50 = local_9cb8;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_9640,other,(StorageBaseType *)local_9d00);
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               &local_7b80,lVar17,0x24);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a000,xpr,
               lVar13,0x18);
    vStack_a120.m_value = vStack_9fe0.m_value;
    peStack_a118 = (element_type *)pMStack_9fd8;
    local_a140._0_8_ = local_a000._0_8_;
    local_a140._8_8_ = local_a000._8_8_;
    LStack_a130.m_matrix = (non_const_type)sStack_9ff0.m_other;
    vStack_a128.m_value = (long)sStack_9fe8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9f60,xpr,
               lVar13,0);
    vStack_9cc8.m_value = (long)(local_8a58 + 0x2d0);
    local_9cb8 = local_8a58;
    dStack_9c70 = (double)vStack_9f40.m_value;
    pMStack_9c68 = pMStack_9f38;
    pdStack_9c90 = (PointerType)local_9f60._0_8_;
    dStack_9c88 = (double)local_9f60._8_8_;
    local_9c80 = (XprTypeNested)sStack_9f50.m_other;
    dStack_9c78 = (double)vStack_9f48.m_value;
    local_9d00._32_8_ = vStack_a128.m_value;
    local_9d00._24_8_ = LStack_a130.m_matrix;
    local_9d00._40_8_ = vStack_a120.m_value;
    vStack_9cd0.m_value = (long)peStack_a118;
    local_9d00._8_8_ = local_a140._0_8_;
    local_9d00._16_8_ = local_a140._8_8_;
    dStack_9cb0 = 0.0;
    local_9ca8 = 9.88131291682493e-324;
    local_9c60 = local_8a58 + 0x390;
    local_9ca0 = 2.22329540628561e-322;
    local_9c48 = 1.18575755001899e-322;
    local_9c40 = 9.88131291682493e-324;
    local_9c38 = 2.22329540628561e-322;
    local_9c50 = local_9cb8;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_9640,other_00,(StorageBaseType *)local_9d00);
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               &local_7b80,lVar17,0x30);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_a000,xpr,
               lVar13,0xc);
    vStack_a120.m_value = vStack_9fe0.m_value;
    peStack_a118 = (element_type *)pMStack_9fd8;
    local_a140._0_8_ = local_a000._0_8_;
    local_a140._8_8_ = local_a000._8_8_;
    LStack_a130.m_matrix = (non_const_type)sStack_9ff0.m_other;
    vStack_a128.m_value = (long)sStack_9fe8.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9f60,xpr,
               lVar13,0);
    auVar7._8_8_ = vStack_a128.m_value;
    auVar7._0_8_ = LStack_a130.m_matrix;
    auVar7._16_8_ = vStack_a120.m_value;
    auVar7._24_8_ = peStack_a118;
    vStack_9cc8.m_value = (long)(local_8a58 + 0x2d0);
    local_9cb8 = local_8a58;
    dStack_9c70 = (double)vStack_9f40.m_value;
    pMStack_9c68 = pMStack_9f38;
    pdStack_9c90 = (PointerType)local_9f60._0_8_;
    dStack_9c88 = (double)local_9f60._8_8_;
    local_9c80 = (XprTypeNested)sStack_9f50.m_other;
    dStack_9c78 = (double)vStack_9f48.m_value;
    local_9d00._8_8_ = local_a140._0_8_;
    local_9d00._16_8_ = local_a140._8_8_;
    stack0xffffffffffff6328 = auVar7._16_16_;
    local_9d00._32_8_ = vStack_a128.m_value;
    local_9d00._24_8_ = LStack_a130.m_matrix;
    dStack_9cb0 = 0.0;
    local_9ca8 = 9.88131291682493e-324;
    local_9c60 = local_8a58 + 0x330;
    local_9ca0 = 2.22329540628561e-322;
    local_9c48 = 5.92878775009496e-323;
    local_9c40 = 9.88131291682493e-324;
    local_9c38 = 2.22329540628561e-322;
    local_9c50 = local_9cb8;
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                      *)&local_9640,other_01,(StorageBaseType *)local_9d00);
    Eigen::Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               &local_7b80,lVar17,0x3c);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,12,1,1,12>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,12,1,false>>const>const>const>>
              ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_1,_12,_false> *)local_9de0,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_12,_1,_1,_12>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_12,_1,_false>_>_>_>_>
                *)&local_9640);
    IVar15 = IVar15 + 3;
    lVar13 = lVar13 + 1;
  }
  IVar15 = 0;
  lVar13 = 0;
  while( true ) {
    if (lVar13 == 8) break;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_a140,xpr,lVar13
               ,0x24);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [6] = (double)(local_8a58 + 0x120);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [8] = (double)local_8a58;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_a120.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_a118;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_a140._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_a140._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_a130.m_matrix;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_a128.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [9] = 1.77863632502849e-322;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [10] = 0.0;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (Matrix<double,_24,_9,_1,_24,_9> *)local_9d00,IVar15,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_a140,xpr,lVar13
               ,0x27);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [6] = (double)(local_8a58 + 0x138);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [8] = (double)local_8a58;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_a120.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_a118;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_a140._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_a140._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_a130.m_matrix;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_a128.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [9] = 1.92685601878086e-322;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [10] = 0.0;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (Matrix<double,_24,_9,_1,_24,_9> *)local_9d00,IVar15,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_a140,xpr,lVar13
               ,0x2a);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [6] = (double)(local_8a58 + 0x150);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [8] = (double)local_8a58;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_a120.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_a118;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_a140._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_a140._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_a130.m_matrix;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_a128.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [9] = 2.07507571253324e-322;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [10] = 0.0;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (Matrix<double,_24,_9,_1,_24,_9> *)local_9d00,IVar15,6);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_a140,xpr,lVar13
               ,0x24);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [6] = (double)(local_8a58 + 0x288);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [8] = (double)local_8a58;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_a120.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_a118;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_a140._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_a140._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_a130.m_matrix;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_a128.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [9] = 1.77863632502849e-322;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [10] = 4.94065645841247e-324;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    lVar17 = IVar15 + 1;
    Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (Matrix<double,_24,_9,_1,_24,_9> *)local_9d00,lVar17,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_a140,xpr,lVar13
               ,0x27);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [6] = (double)(local_8a58 + 0x2a0);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [8] = (double)local_8a58;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_a120.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_a118;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_a140._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_a140._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_a130.m_matrix;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_a128.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [9] = 1.92685601878086e-322;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [10] = 4.94065645841247e-324;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (Matrix<double,_24,_9,_1,_24,_9> *)local_9d00,lVar17,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_a140,xpr,lVar13
               ,0x2a);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [6] = (double)(local_8a58 + 0x2b8);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_a120.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_a118;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_a140._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_a140._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_a130.m_matrix;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_a128.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [9] = 2.07507571253324e-322;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [10] = 4.94065645841247e-324;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [8] = (double)local_8a58;
    Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (Matrix<double,_24,_9,_1,_24,_9> *)local_9d00,lVar17,6);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_a140,xpr,lVar13
               ,0x24);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [6] = (double)(local_8a58 + 0x3f0);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_a120.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_a118;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_a140._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_a140._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_a130.m_matrix;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_a128.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [9] = 1.77863632502849e-322;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [10] = 9.88131291682493e-324;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    lVar17 = IVar15 + 2;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [8] = (double)local_8a58;
    Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (Matrix<double,_24,_9,_1,_24,_9> *)local_9d00,lVar17,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_a140,xpr,lVar13
               ,0x27);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [6] = (double)(local_8a58 + 0x408);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [8] = (double)local_8a58;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_a120.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_a118;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_a140._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_a140._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_a130.m_matrix;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_a128.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [9] = 1.92685601878086e-322;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [10] = 9.88131291682493e-324;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (Matrix<double,_24,_9,_1,_24,_9> *)local_9d00,lVar17,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_9640);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_a140,xpr,lVar13
               ,0x2a);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [6] = (double)(local_8a58 + 0x420);
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [8] = (double)local_8a58;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [4] = (double)vStack_a120.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [5] = (double)peStack_a118;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0] = (double)local_a140._0_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [1] = (double)local_a140._8_8_;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [2] = (double)LStack_a130.m_matrix;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [3] = (double)vStack_a128.m_value;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [9] = 2.07507571253324e-322;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [10] = 9.88131291682493e-324;
    local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
    [0xb] = 2.22329540628561e-322;
    Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (Matrix<double,_24,_9,_1,_24,_9> *)local_9d00,lVar17,6);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,45,3,0,45,3>,3,1,false>>const>>
              ((Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_1,_3,_false> *)local_a000,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>,_const_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_45,_3,_0,_45,_3>,_3,_1,_false>_>_>
                *)&local_9640);
    lVar13 = lVar13 + 1;
    IVar15 = IVar15 + 3;
  }
  std::__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *)
             &local_9640,
             (__shared_ptr<chrono::fea::ChMaterialBeamANCF,_(__gnu_cxx::_Lock_policy)2> *)local_a010
            );
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Matrix<double,3,3,1,3,3>>
            (local_9e60,
             (DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)
             ((long)local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.
                    m_storage.m_data.array[0] + 0x40));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
              m_data.array + 1));
  local_8620.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = 0.0;
  local_8620.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = 0.0;
  local_8620.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = 4.44659081257122e-323;
  local_8620.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = (double)local_9d00;
  local_8620.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = (double)local_9d00;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>
                    *)local_a140,(double *)local_9e60,(StorageBaseType *)&local_8620);
  dVar14 = (double)((ulong)local_9d00 | 0x18);
  local_7c20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = 0.0;
  local_7c20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = 1.48219693752374e-323;
  local_7c20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = 4.44659081257122e-323;
  local_7c20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = dVar14;
  local_7c20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = (double)local_9d00;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>
                    *)local_a000,&local_9e58,(StorageBaseType *)&local_7c20);
  sVar10.m_other = sStack_9ff0.m_other;
  LVar8.m_matrix = LStack_a130.m_matrix;
  local_7c80._0_8_ = &vStack_9cd0;
  local_9de0._0_8_ = vStack_a128.m_value;
  local_9de0._8_8_ = vStack_a120.m_value;
  local_9de0._16_8_ = peStack_a118;
  local_9de0._24_8_ = vStack_a110.m_value;
  local_9de0._32_8_ = vStack_a108.m_value;
  local_9de0._40_8_ = pMStack_a100;
  local_7c80._24_8_ = 0.0;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = sStack_9fe8.m_other;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [1] = (double)vStack_9fe0.m_value;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_9fd8;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_9fd0.m_value;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_9fc8.m_value;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = (double)vStack_9fc0.m_value;
  local_7c80._32_8_ = 2.96439387504748e-323;
  local_7c80._40_8_ = 4.44659081257122e-323;
  local_7c80._16_8_ = local_9d00;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>
                    *)local_9f60,&local_9e50,(StorageBaseType *)local_7c80);
  local_7ce0._0_8_ =
       local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
       array + 0x48;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)LVar8.m_matrix;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = (double)local_9de0._0_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = (double)local_9de0._8_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = (double)local_9de0._16_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = (double)local_9de0._24_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [9] = (double)local_9de0._32_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_9de0._40_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xe] = sVar10.m_other;
  local_7ce0._16_8_ = &local_7b80;
  local_7ce0._24_8_ = 0;
  local_7ce0._32_8_ = 0x48;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
          .array[0];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x10] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[1];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[2];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[3];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[4];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[5];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = sStack_9f50.m_other;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = (double)vStack_9f48.m_value;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1b] = (double)vStack_9f40.m_value;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1c] = (double)pMStack_9f38;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)vStack_9f30.m_value;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1e] = (double)vStack_9f28.m_value;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = dStack_9f20;
  local_7ce0._40_8_ = 4.0019317313141e-322;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,24,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,3,1,24,3>const>const,Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,24,3,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,3,1,24,3>const>const,Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,24,3,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,3,1,24,3>const>const,Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,24,3,false>const>const>>
            ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_24,_3,_false> *)local_7ce0,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>_>
              *)&local_9640);
  local_8620.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = 0.0;
  local_8620.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = 0.0;
  local_8620.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = 4.44659081257122e-323;
  local_8620.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = (double)local_9d00;
  local_8620.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = (double)local_9d00;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>
                    *)local_a140,&local_9e48,(StorageBaseType *)&local_8620);
  local_7c20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = (double)local_9d00;
  local_7c20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = 0.0;
  local_7c20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = 1.48219693752374e-323;
  local_7c20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = 4.44659081257122e-323;
  local_7c20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = dVar14;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>
                    *)local_a000,&local_9e40,(StorageBaseType *)&local_7c20);
  LVar8.m_matrix = LStack_a130.m_matrix;
  local_7c80._0_8_ = &vStack_9cd0;
  local_7c80._16_8_ = local_9d00;
  local_7c80._24_8_ = 0.0;
  local_a010 = (element_type *)sStack_9ff0.m_other;
  local_9de0._0_8_ = vStack_a128.m_value;
  local_9de0._8_8_ = vStack_a120.m_value;
  local_9de0._16_8_ = peStack_a118;
  local_9de0._24_8_ = vStack_a110.m_value;
  local_9de0._32_8_ = vStack_a108.m_value;
  local_9de0._40_8_ = pMStack_a100;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = sStack_9fe8.m_other;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [1] = (double)vStack_9fe0.m_value;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_9fd8;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_9fd0.m_value;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_9fc8.m_value;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = (double)vStack_9fc0.m_value;
  local_7c80._32_8_ = 2.96439387504748e-323;
  local_7c80._40_8_ = 4.44659081257122e-323;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>
                    *)local_9f60,&local_9e38,(StorageBaseType *)local_7c80);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)LVar8.m_matrix;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = (double)local_9de0._0_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = (double)local_9de0._8_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = (double)local_9de0._16_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = (double)local_9de0._24_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [9] = (double)local_9de0._32_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_9de0._40_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xe] = (double)local_a010;
  local_7ce0._0_8_ =
       local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
       array + 0x4b;
  local_7ce0._16_8_ = &local_7b80;
  local_7ce0._24_8_ = 0;
  local_7ce0._32_8_ = 0x4b;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
          .array[0];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x10] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[1];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[2];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[3];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[4];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[5];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = sStack_9f50.m_other;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = (double)vStack_9f48.m_value;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1b] = (double)vStack_9f40.m_value;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1c] = (double)pMStack_9f38;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)vStack_9f30.m_value;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1e] = (double)vStack_9f28.m_value;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = dStack_9f20;
  local_7ce0._40_8_ = 4.0019317313141e-322;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,24,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,3,1,24,3>const>const,Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,24,3,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,3,1,24,3>const>const,Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,24,3,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,3,1,24,3>const>const,Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,24,3,false>const>const>>
            ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_24,_3,_false> *)local_7ce0,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>_>
              *)&local_9640);
  local_8620.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = 0.0;
  local_8620.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = 0.0;
  local_8620.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = 4.44659081257122e-323;
  local_8620.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = (double)local_9d00;
  local_8620.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = (double)local_9d00;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>
                    *)local_a140,&local_9e30,(StorageBaseType *)&local_8620);
  local_7c20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = 0.0;
  local_7c20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = 1.48219693752374e-323;
  local_7c20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = 4.44659081257122e-323;
  local_7c20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = dVar14;
  local_7c20.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = (double)local_9d00;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>
                    *)local_a000,&local_9e28,(StorageBaseType *)&local_7c20);
  sVar10.m_other = sStack_9ff0.m_other;
  LVar8.m_matrix = LStack_a130.m_matrix;
  local_7c80._0_8_ = &vStack_9cd0;
  local_7c80._16_8_ = local_9d00;
  local_7c80._24_8_ = 0.0;
  local_9de0._0_8_ = vStack_a128.m_value;
  local_9de0._8_8_ = vStack_a120.m_value;
  local_9de0._16_8_ = peStack_a118;
  local_9de0._24_8_ = vStack_a110.m_value;
  local_9de0._32_8_ = vStack_a108.m_value;
  local_9de0._40_8_ = pMStack_a100;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [0] = sStack_9fe8.m_other;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [1] = (double)vStack_9fe0.m_value;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [2] = (double)pMStack_9fd8;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [3] = (double)vStack_9fd0.m_value;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [4] = (double)vStack_9fc8.m_value;
  local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data.array
  [5] = (double)vStack_9fc0.m_value;
  local_7c80._32_8_ = 2.96439387504748e-323;
  local_7c80._40_8_ = 4.44659081257122e-323;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>
                    *)local_9f60,&local_9e20,(StorageBaseType *)local_7c80);
  local_7ce0._0_8_ =
       local_7b80.super_PlainObjectBase<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>.m_storage.m_data.
       array + 0x4e;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)LVar8.m_matrix;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = (double)local_9de0._0_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = (double)local_9de0._8_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = (double)local_9de0._16_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = (double)local_9de0._24_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [9] = (double)local_9de0._32_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_9de0._40_8_;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xe] = sVar10.m_other;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
          .array[0];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x10] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[1];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[2];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[3];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[4];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = local_85c0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
           m_data.array[5];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = sStack_9f50.m_other;
  local_7ce0._24_8_ = 0;
  local_7ce0._32_8_ = 0x4e;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = (double)vStack_9f48.m_value;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1b] = (double)vStack_9f40.m_value;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1c] = (double)pMStack_9f38;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)vStack_9f30.m_value;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1e] = (double)vStack_9f28.m_value;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = dStack_9f20;
  local_7ce0._40_8_ = 4.0019317313141e-322;
  local_7ce0._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_7b80;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,24,81,1,24,81>,24,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,3,1,24,3>const>const,Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,24,3,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,3,1,24,3>const>const,Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,24,3,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,24,3,1,24,3>const>const,Eigen::Block<Eigen::Matrix<double,24,9,1,24,9>,24,3,false>const>const>>
            ((Block<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_24,_3,_false> *)local_7ce0,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_24,_3,_1,_24,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_24,_9,_1,_24,_9>,_24,_3,_false>_>_>
              *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = (double)&local_3d40;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [1] = (double)&local_7b80;
  Eigen::internal::
  call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,Eigen::Product<Eigen::Matrix<double,24,81,1,24,81>,Eigen::Transpose<Eigen::Matrix<double,24,81,1,24,81>>,0>>
            ((Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_> *)local_9ef0
             ,(Product<Eigen::Matrix<double,_24,_81,_1,_24,_81>,_Eigen::Transpose<Eigen::Matrix<double,_24,_81,_1,_24,_81>_>,_0>
               *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = (double)local_7fb0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = (double)local_7e48;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = (double)local_8118;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = 0.0;
  pdVar3 = (PointerType)(local_8490 + 0xa8);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xc] = 1.48219693752374e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = 0.0;
  puVar4 = local_8490 + 0x210;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = 1.97626258336499e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x27] = 2.47032822920623e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [2] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)puVar4;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_8550;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_9f60,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [2] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)puVar4;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = (double)puVar4;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_8550;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_9de0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = (double)&DAT_3ff0000000000000;
  local_a140._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_9de0;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_> *)local_a140,
             (Scalar *)&local_9640);
  local_a140._0_8_ = *scalar_02 + *scalar_02;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_9640,(double *)local_a140,(StorageBaseType *)local_9f60);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_9de0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_9640);
  local_a140._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_9de0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar1;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_a140,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = (scalar->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.
        array[0] * 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)local_9de0,(Scalar *)&local_9640)
  ;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [2] = (double)(local_8550 + 0x60);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = (double)(local_8118 + 0x60);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = (double)local_7f50;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = (double)local_7de8;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = 5.92878775009496e-323;
  pdVar3 = (PointerType)(local_8490 + 0x108);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xc] = 1.48219693752374e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)(local_8490 + 0x270);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = 1.97626258336499e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x27] = 2.47032822920623e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_a140._0_8_ = local_9f60;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_8550;
  Eigen::NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase> *)local_a140,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [2] = (double)(local_8550 + 0x60);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)(local_8490 + 0x270);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.
        array[2];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
           m_data.array[0x1d];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_8550;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_85c0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = (double)&DAT_3ff0000000000000;
  local_a140._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_85c0;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_> *)local_a140,
             (Scalar *)&local_9640);
  local_a140._0_8_ = *scalar_02 + *scalar_02;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_9640,(double *)local_a140,(StorageBaseType *)local_9f60);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_85c0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_9640);
  local_a140._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_85c0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar1;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_a140,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = *scalar_01 * 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)&local_85c0,(Scalar *)&local_9640
            );
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [2] = (double)local_8490;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = (double)local_8058;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = (double)local_7ef0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = (double)local_7d88;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = 1.18575755001899e-322;
  pdVar3 = (PointerType)(local_8490 + 0x168);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xc] = 1.48219693752374e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)(local_8490 + 0x2d0);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = 1.97626258336499e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x27] = 2.47032822920623e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_a140._0_8_ = local_9f60;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_8550;
  Eigen::NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase> *)local_a140,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [2] = (double)local_8490;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)(local_8490 + 0x2d0);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.
        array[2];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.
           m_data.array[0x1d];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_8550;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_8620,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = (double)&DAT_3ff0000000000000;
  local_a140._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_8620;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_> *)local_a140,
             (Scalar *)&local_9640);
  local_a140._0_8_ = *scalar_02 + *scalar_02;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_9640,(double *)local_a140,(StorageBaseType *)local_9f60);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_8620,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_9640);
  local_a140._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_8620;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar1;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_a140,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = *scalar_00 * 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)&local_8620,(Scalar *)&local_9640
            );
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = (double)local_8490;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [9] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = (double)(local_8118 + 0x60);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xe] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = 1.48219693752374e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x10] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = (double)(local_8490 + 0x168);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = (double)local_7f50;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x16] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1b] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = (double)(local_8490 + 0x2d0);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1c] = 1.97626258336499e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = (double)local_7de8;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x24] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x29] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x2e] = (double)(local_8550 + 0x60);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x2a] = 2.47032822920623e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x2b] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x34] = (double)local_8058;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x31] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x32] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x33] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x37] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x38] = 1.48219693752374e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x42] = (double)local_7ef0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x39] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x3f] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x40] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x41] = 2.22329540628561e-322;
  local_a140._0_8_ = local_9f60;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x4a] = (double)(local_8490 + 0x270);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x45] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x46] = 1.97626258336499e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x47] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x50] = (double)local_7d88;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x4d] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x4e] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x4f] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x53] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x54] = 2.47032822920623e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x55] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x30] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x36] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x3c] = (double)(local_8490 + 0x108);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x3e] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x44] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x4c] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x52] = (double)local_8550;
  Eigen::NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase> *)local_a140,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [2] = (double)(local_8550 + 0x60);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = (double)local_8490;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)(local_8490 + 0x270);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = (double)(local_8490 + 0x2d0);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = (double)(local_8490 + 0x108);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = (double)(local_8490 + 0x168);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_8550;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_7c20,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_9640);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_9640,scalar_02,(StorageBaseType *)local_9f60);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_7c20,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_9640);
  local_a140._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)&local_7c20;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar1;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_a140,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_9640);
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)&local_7c20,other);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = (double)local_8490;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = (double)local_8118;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [9] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xe] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = 1.48219693752374e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x10] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = (double)local_7fb0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x16] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = (double)(local_8490 + 0x2d0);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1c] = 1.97626258336499e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = (double)local_7e48;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x24] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x29] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x34] = (double)local_8058;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x2a] = 2.47032822920623e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x2b] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x3c] = (double)(local_8490 + 0xa8);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x31] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x32] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x33] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x42] = (double)local_7ef0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x37] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x38] = 1.48219693752374e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x39] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x3f] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x40] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x41] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x50] = (double)local_7d88;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x45] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x46] = 1.97626258336499e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x47] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x4d] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x4e] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x4f] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x53] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x54] = 2.47032822920623e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x55] = 2.22329540628561e-322;
  local_a140._0_8_ = local_9f60;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = (double)(local_8490 + 0x168);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x2e] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x30] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x36] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x3e] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x44] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x4a] = (double)(local_8490 + 0x210);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x4c] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x52] = (double)local_8550;
  Eigen::NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase> *)local_a140,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = (double)local_8490;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = (double)(local_8490 + 0xa8);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = (double)(local_8490 + 0x168);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = (double)(local_8490 + 0x2d0);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = 1.18575755001899e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [2] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)(local_8490 + 0x210);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_8550;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_7c80,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_9640);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_9640,scalar_02,(StorageBaseType *)local_9f60);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_7c80,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_9640);
  local_a140._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_7c80;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar1;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_a140,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_9640);
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)local_7c80,other_00);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = (double)(local_8550 + 0x60);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = (double)local_8118;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [9] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xe] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = 1.48219693752374e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x10] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = (double)(local_8490 + 0x108);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = (double)local_7fb0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x16] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1b] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = (double)(local_8490 + 0x270);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = (double)local_7e48;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1c] = 1.97626258336499e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x24] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x29] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x34] = (double)(local_8118 + 0x60);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x2a] = 2.47032822920623e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x2b] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x3c] = (double)(local_8490 + 0xa8);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x31] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x32] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x33] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x42] = (double)local_7f50;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x37] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x38] = 1.48219693752374e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x39] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x3f] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x40] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x41] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x50] = (double)local_7de8;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x45] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x46] = 1.97626258336499e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x4a] = (double)(local_8490 + 0x210);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x47] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x4d] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x4e] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x4f] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x53] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x54] = 2.47032822920623e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x55] = 2.22329540628561e-322;
  local_a140._0_8_ = (StorageBaseType *)local_9f60;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x2e] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x30] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x36] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x3e] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x44] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x4c] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x52] = (double)local_8550;
  Eigen::NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,12,1,0,12,1>,Eigen::MatrixBase> *)local_a140,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = (double)(local_8550 + 0x60);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = (double)(local_8490 + 0xa8);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = (double)(local_8490 + 0x108);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)(local_8490 + 0x210);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = (double)(local_8490 + 0x270);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = 5.92878775009496e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [2] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_8550;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,12,1,false>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_7ce0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_12,_1,_false>_>_>_>
              *)&local_9640);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>
                    *)&local_9640,scalar_02,(StorageBaseType *)local_9f60);
  Eigen::MatrixBase<Eigen::Matrix<double,12,1,0,12,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_7ce0,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Matrix<double,_12,_1,_0,_12,_1>_>_>
              *)&local_9640);
  local_a140._0_8_ = (PlainObjectBase<Eigen::Matrix<double,12,1,0,12,1>> *)local_7ce0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar1;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,12,1,0,12,1>>> *)local_a140,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_9640);
  Eigen::DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_> *)local_7ce0,other_01);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [2] = (double)(local_8490 + 0x60);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = (double)local_7ff8;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = 1.77863632502849e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = (double)local_7e90;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = 1.77863632502849e-322;
  pdVar3 = (PointerType)(local_8490 + 0x1c8);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xc] = 1.48219693752374e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = 1.77863632502849e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = (double)local_7d28;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = 1.77863632502849e-322;
  puVar4 = local_8490 + 0x330;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = 1.97626258336499e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = 1.77863632502849e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = 1.77863632502849e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x27] = 2.47032822920623e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)puVar4;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_8550;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>>
            (local_9e80,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
              *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [2] = (double)(local_8490 + 0x60);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = 1.77863632502849e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = 1.77863632502849e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = 1.77863632502849e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = 1.77863632502849e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = 1.77863632502849e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = 1.77863632502849e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.
        array[2];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)puVar4;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = (double)puVar4;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_8550;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>>
            (local_8a70,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
              *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = (double)&DAT_3ff0000000000000;
  local_a140._0_8_ = local_8a70;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)local_a140,
             (Scalar *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_8a70,(Scalar *)&local_9640);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&local_9640,scalar_02,(StorageBaseType *)local_9e80);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_8a70,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_9640);
  local_a140._0_8_ = local_8a70;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar2;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>> *)local_a140,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [2] = (double)(local_8490 + 0x78);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = (double)local_7fe0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = 1.92685601878086e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = (double)local_7e78;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = 1.92685601878086e-322;
  pdVar3 = (PointerType)(local_8490 + 0x1e0);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xc] = 1.48219693752374e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = 1.92685601878086e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = (double)local_7d10;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = 1.92685601878086e-322;
  puVar4 = local_8490 + 0x348;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = 1.97626258336499e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = 1.92685601878086e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = 1.92685601878086e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x27] = 2.47032822920623e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_a140._0_8_ = local_9e80;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)puVar4;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_8550;
  Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)local_a140,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
              *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [2] = (double)(local_8490 + 0x78);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = 1.92685601878086e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = 1.92685601878086e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = 1.92685601878086e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = 1.92685601878086e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = 1.92685601878086e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = 1.92685601878086e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.
        array[2];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)puVar4;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = (double)puVar4;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_8550;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>>
            (local_8a88,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
              *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = (double)&DAT_3ff0000000000000;
  local_a140._0_8_ = local_8a88;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)local_a140,
             (Scalar *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_8a88,(Scalar *)&local_9640);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&local_9640,scalar_02,(StorageBaseType *)local_9e80);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_8a88,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_9640);
  local_a140._0_8_ = local_8a88;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar2;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>> *)local_a140,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [2] = (double)(local_8490 + 0x90);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = (double)local_7fc8;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = 2.07507571253324e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = 2.07507571253324e-322;
  pdVar3 = (PointerType)(local_8490 + 0x1f8);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xc] = 1.48219693752374e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = (double)local_7e60;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = 2.07507571253324e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = 2.07507571253324e-322;
  puVar4 = local_8490 + 0x360;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = 1.97626258336499e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = (double)local_7cf8;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = 2.07507571253324e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = 2.07507571253324e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x27] = 2.47032822920623e-323;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_a140._0_8_ = local_9e80;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)puVar4;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_8550;
  Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)local_a140,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
              *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [2] = (double)(local_8490 + 0x90);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [5] = 2.07507571253324e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [6] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [7] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xb] = 2.07507571253324e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xc] = 0.0;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xd] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x12] = 2.07507571253324e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x13] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x14] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x18] = 2.07507571253324e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x19] = 4.94065645841247e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1a] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x20] = 2.07507571253324e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x21] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x22] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x26] = 2.07507571253324e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x27] = 9.88131291682493e-324;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x28] = 2.22329540628561e-322;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [4] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [8] = local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.
        array[2];
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [10] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0xf] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x11] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x15] = (double)pdVar3;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x17] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1d] = (double)puVar4;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x1f] = (double)local_8550;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x23] = (double)puVar4;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0x25] = (double)local_8550;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const,Eigen::Block<Eigen::Matrix<double,45,6,0,45,6>,3,1,false>const>const>>
            (local_9d18,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>,_const_Eigen::Block<Eigen::Matrix<double,_45,_6,_0,_45,_6>,_3,_1,_false>_>_>_>
              *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = (double)&DAT_3ff0000000000000;
  local_a140._0_8_ = local_9d18;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::operator-=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)local_a140,
             (Scalar *)&local_9640);
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = 0.5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_9d18,(Scalar *)&local_9640);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)&local_9640,scalar_02,(StorageBaseType *)local_9e80);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_9d18,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_9640);
  local_a140._0_8_ = local_9d18;
  local_9640.super_PlainObjectBase<Eigen::Matrix<double,_8,_45,_1,_8,_45>_>.m_storage.m_data.array
  [0] = (double)pMVar2;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>>::operator*=
            ((ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,3,1,0,3,1>>> *)local_a140,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_9640);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_a000,(double *)local_9e60,(StorageBaseType *)local_8a70);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_9d80,&local_9e58,(StorageBaseType *)local_8a88);
  vStack_a128.m_value = (long)sStack_9ff0.m_other;
  vStack_a120.m_value = (long)sStack_9fe8.m_other;
  pMStack_a100 = (Matrix<double,__1,__1,_0,__1,__1> *)sStack_9d70.m_other;
  local_a0f8 = (RhsNested)sStack_9d68.m_other;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_9e18,&local_9e50,(StorageBaseType *)local_9d18);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_9640,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)local_a140,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_9e18);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_8aa0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_9640);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_a000,&local_9e48,(StorageBaseType *)local_8a70);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_9d80,&local_9e40,(StorageBaseType *)local_8a88);
  vStack_a128.m_value = (long)sStack_9ff0.m_other;
  vStack_a120.m_value = (long)sStack_9fe8.m_other;
  pMStack_a100 = (Matrix<double,__1,__1,_0,__1,__1> *)sStack_9d70.m_other;
  local_a0f8 = (RhsNested)sStack_9d68.m_other;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_9e18,&local_9e38,(StorageBaseType *)local_9d18);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_9640,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)local_a140,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_9e18);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_8ab8,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_9640);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_a000,&local_9e30,(StorageBaseType *)local_8a70);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_9d80,&local_9e28,(StorageBaseType *)local_8a88);
  vStack_a128.m_value = (long)sStack_9ff0.m_other;
  vStack_a120.m_value = (long)sStack_9fe8.m_other;
  pMStack_a100 = (Matrix<double,__1,__1,_0,__1,__1> *)sStack_9d70.m_other;
  local_a0f8 = (RhsNested)sStack_9d68.m_other;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)local_9e18,&local_9e20,(StorageBaseType *)local_9d18);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_9640,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)local_a140,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)local_9e18);
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            (local_8ad0,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_9640);
  for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9e18,xpr,
               lVar13,0);
    vStack_9fe0.m_value = vStack_9df8.m_value;
    pMStack_9fd8 = pMStack_9df0;
    local_a000._0_8_ = local_9e18._0_8_;
    local_a000._8_8_ = local_9e18._8_8_;
    sStack_9ff0.m_other = sStack_9e08.m_other;
    sStack_9fe8.m_other = (double)vStack_9e00.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9ee0,xpr,
               lVar13,0xc);
    vStack_9d60.m_value = vStack_9ec0.m_value;
    dStack_9d58 = dStack_9eb8;
    local_9d80._0_8_ = local_9ee0._0_8_;
    local_9d80._8_8_ = local_9ee0._8_8_;
    sStack_9d70.m_other = (double)pMStack_9ed0;
    sStack_9d68.m_other = (double)vStack_9ec8.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9eb0,xpr,
               lVar13,0x18);
    local_a0a8.m_matrix = (non_const_type)local_7c80;
    vStack_a080.m_value = vStack_9e90.m_value;
    dStack_a078 = dStack_9e88;
    pdStack_a0a0 = (PointerType)local_9eb0._0_8_;
    dStack_a098 = (double)local_9eb0._8_8_;
    local_a090 = pMStack_9ea0;
    vStack_a088.m_value = vStack_9e98.m_value;
    LStack_a130.m_matrix = (non_const_type)local_9de0;
    pMStack_a100 = pMStack_9fd8;
    vStack_a128.m_value = local_a000._0_8_;
    vStack_a120.m_value = local_a000._8_8_;
    peStack_a118 = (element_type *)sStack_9ff0.m_other;
    vStack_a110.m_value = (long)sStack_9fe8.m_other;
    vStack_a0c8.m_value = vStack_9d60.m_value;
    dStack_a0c0 = dStack_9d58;
    pdStack_a0e8 = (PointerType)local_9d80._0_8_;
    dStack_a0e0 = (double)local_9d80._8_8_;
    local_a0d8 = (Matrix<double,__1,__1,_0,__1,__1> *)sStack_9d70.m_other;
    vStack_a0d0.m_value = (long)sStack_9d68.m_other;
    local_a0f0.m_matrix = (non_const_type)local_7ce0;
    Eigen::Block<Eigen::Matrix<double,_8,_45,_1,_8,_45>,_1,_12,_false>::Block
              (&local_7bb0,&local_9640,lVar13,0);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,8,45,1,8,45>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const>>
              (&local_7bb0,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>_>
                *)local_a140);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9e18,xpr,
               lVar13,0);
    vStack_9fe0.m_value = vStack_9df8.m_value;
    pMStack_9fd8 = pMStack_9df0;
    local_a000._0_8_ = local_9e18._0_8_;
    local_a000._8_8_ = local_9e18._8_8_;
    sStack_9ff0.m_other = sStack_9e08.m_other;
    sStack_9fe8.m_other = (double)vStack_9e00.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9ee0,xpr,
               lVar13,0xc);
    vStack_9d60.m_value = vStack_9ec0.m_value;
    dStack_9d58 = dStack_9eb8;
    local_9d80._0_8_ = local_9ee0._0_8_;
    local_9d80._8_8_ = local_9ee0._8_8_;
    sStack_9d70.m_other = (double)pMStack_9ed0;
    sStack_9d68.m_other = (double)vStack_9ec8.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9eb0,xpr,
               lVar13,0x18);
    vStack_a080.m_value = vStack_9e90.m_value;
    dStack_a078 = dStack_9e88;
    pdStack_a0a0 = (PointerType)local_9eb0._0_8_;
    dStack_a098 = (double)local_9eb0._8_8_;
    local_a090 = pMStack_9ea0;
    vStack_a088.m_value = vStack_9e98.m_value;
    pMStack_a100 = pMStack_9fd8;
    local_a0a8.m_matrix = &local_7c20;
    vStack_a128.m_value = local_a000._0_8_;
    vStack_a120.m_value = local_a000._8_8_;
    peStack_a118 = (element_type *)sStack_9ff0.m_other;
    vStack_a110.m_value = (long)sStack_9fe8.m_other;
    local_a0f0.m_matrix = &local_85c0;
    vStack_a0c8.m_value = vStack_9d60.m_value;
    dStack_a0c0 = dStack_9d58;
    pdStack_a0e8 = (PointerType)local_9d80._0_8_;
    dStack_a0e0 = (double)local_9d80._8_8_;
    local_a0d8 = (Matrix<double,__1,__1,_0,__1,__1> *)sStack_9d70.m_other;
    vStack_a0d0.m_value = (long)sStack_9d68.m_other;
    LStack_a130.m_matrix = (non_const_type)local_7ce0;
    Eigen::Block<Eigen::Matrix<double,_8,_45,_1,_8,_45>,_1,_12,_false>::Block
              (&local_7bb0,&local_9640,lVar13,0xc);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,8,45,1,8,45>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const>>
              (&local_7bb0,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>_>
                *)local_a140);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9e18,xpr,
               lVar13,0);
    vStack_9fe0.m_value = vStack_9df8.m_value;
    pMStack_9fd8 = pMStack_9df0;
    local_a000._0_8_ = local_9e18._0_8_;
    local_a000._8_8_ = local_9e18._8_8_;
    sStack_9ff0.m_other = sStack_9e08.m_other;
    sStack_9fe8.m_other = (double)vStack_9e00.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9ee0,xpr,
               lVar13,0xc);
    vStack_9d60.m_value = vStack_9ec0.m_value;
    dStack_9d58 = dStack_9eb8;
    local_9d80._0_8_ = local_9ee0._0_8_;
    local_9d80._8_8_ = local_9ee0._8_8_;
    sStack_9d70.m_other = (double)pMStack_9ed0;
    sStack_9d68.m_other = (double)vStack_9ec8.m_value;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_12,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false> *)local_9eb0,xpr,
               lVar13,0x18);
    LStack_a130.m_matrix = (non_const_type)local_7c80;
    vStack_a080.m_value = vStack_9e90.m_value;
    dStack_a078 = dStack_9e88;
    pdStack_a0a0 = (PointerType)local_9eb0._0_8_;
    dStack_a098 = (double)local_9eb0._8_8_;
    local_a090 = pMStack_9ea0;
    vStack_a088.m_value = vStack_9e98.m_value;
    pMStack_a100 = pMStack_9fd8;
    vStack_a128.m_value = local_a000._0_8_;
    vStack_a120.m_value = local_a000._8_8_;
    peStack_a118 = (element_type *)sStack_9ff0.m_other;
    vStack_a110.m_value = (long)sStack_9fe8.m_other;
    local_a0f0.m_matrix = &local_7c20;
    local_a0a8.m_matrix = &local_8620;
    vStack_a0c8.m_value = vStack_9d60.m_value;
    dStack_a0c0 = dStack_9d58;
    pdStack_a0e8 = (PointerType)local_9d80._0_8_;
    dStack_a0e0 = (double)local_9d80._8_8_;
    local_a0d8 = (Matrix<double,__1,__1,_0,__1,__1> *)sStack_9d70.m_other;
    vStack_a0d0.m_value = (long)sStack_9d68.m_other;
    Eigen::Block<Eigen::Matrix<double,_8,_45,_1,_8,_45>,_1,_12,_false>::Block
              (&local_7bb0,&local_9640,lVar13,0x18);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,8,45,1,8,45>,1,12,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,12,1,0,12,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,12,false>const>const>>
              (&local_7bb0,
               (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_12,_false>_>_>
                *)local_a140);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_a000,xpr,lVar13
               ,0x24);
    local_a140._0_8_ = local_8aa0;
    peStack_a118 = (element_type *)vStack_9fe0.m_value;
    vStack_a110.m_value = (long)pMStack_9fd8;
    local_a140._8_8_ = local_a000._0_8_;
    LStack_a130.m_matrix = (non_const_type)local_a000._8_8_;
    vStack_a128.m_value = (long)sStack_9ff0.m_other;
    vStack_a120.m_value = (long)sStack_9fe8.m_other;
    Eigen::Block<Eigen::Matrix<double,_8,_45,_1,_8,_45>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_8,_45,_1,_8,_45>,_1,_3,_false> *)local_9d80,&local_9640,
               lVar13,0x24);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,8,45,1,8,45>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const>>
              ((Block<Eigen::Matrix<double,_8,_45,_1,_8,_45>,_1,_3,_false> *)local_9d80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>_>
                *)local_a140);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_a000,xpr,lVar13
               ,0x27);
    local_a140._0_8_ = local_8ab8;
    peStack_a118 = (element_type *)vStack_9fe0.m_value;
    vStack_a110.m_value = (long)pMStack_9fd8;
    local_a140._8_8_ = local_a000._0_8_;
    LStack_a130.m_matrix = (non_const_type)local_a000._8_8_;
    vStack_a128.m_value = (long)sStack_9ff0.m_other;
    vStack_a120.m_value = (long)sStack_9fe8.m_other;
    Eigen::Block<Eigen::Matrix<double,_8,_45,_1,_8,_45>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_8,_45,_1,_8,_45>,_1,_3,_false> *)local_9d80,&local_9640,
               lVar13,0x27);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,8,45,1,8,45>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const>>
              ((Block<Eigen::Matrix<double,_8,_45,_1,_8,_45>,_1,_3,_false> *)local_9d80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>_>
                *)local_a140);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false> *)local_a000,xpr,lVar13
               ,0x2a);
    local_a140._0_8_ = local_8ad0;
    peStack_a118 = (element_type *)vStack_9fe0.m_value;
    vStack_a110.m_value = (long)pMStack_9fd8;
    local_a140._8_8_ = local_a000._0_8_;
    LStack_a130.m_matrix = (non_const_type)local_a000._8_8_;
    vStack_a128.m_value = (long)sStack_9ff0.m_other;
    vStack_a120.m_value = (long)sStack_9fe8.m_other;
    Eigen::Block<Eigen::Matrix<double,_8,_45,_1,_8,_45>,_1,_3,_false>::Block
              ((Block<Eigen::Matrix<double,_8,_45,_1,_8,_45>,_1,_3,_false> *)local_9d80,&local_9640,
               lVar13,0x2a);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,8,45,1,8,45>,1,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>const,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,3,false>const>>
              ((Block<Eigen::Matrix<double,_8,_45,_1,_8,_45>,_1,_3,_false> *)local_9d80,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,_3,_false>_>
                *)local_a140);
  }
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_36,_1,_0,_36,_1>_>,_const_Eigen::Matrix<double,_36,_1,_0,_36,_1>_>
                    *)local_a000,&local_9e68,(StorageBaseType *)&local_a008->m_MassMatrix);
  Eigen::PlainObjectBase<Eigen::Matrix<double,36,1,0,36,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,36,1,0,36,1>const>const,Eigen::Matrix<double,36,1,0,36,1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,36,1,0,36,1>> *)local_a140,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_36,_1,_0,_36,_1>_>,_const_Eigen::Matrix<double,_36,_1,_0,_36,_1>_>_>
              *)local_a000);
  lVar17 = 0;
  uVar5 = 0;
  for (lVar13 = 0; lVar13 != 8; lVar13 = lVar13 + 1) {
    row = lVar13 * 3 + 1;
    row_00 = lVar13 * 3 + 2;
    local_a1a0 = lVar13;
    for (lVar16 = 0; col = lVar17 + lVar16, col != 0x18; lVar16 = lVar16 + 3) {
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> *)local_9e18,xpr,
                 lVar13);
      Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                        *)local_9d80,&local_9ee8,(StorageBaseType *)local_9e18);
      Eigen::Block<Eigen::Matrix<double,_8,_45,_1,_8,_45>,_1,_45,_true>::Block
                ((Block<Eigen::Matrix<double,_8,_45,_1,_8,_45>,_1,_45,_true> *)local_9eb0,
                 &local_9640,local_a1a0);
      vStack_9ec0.m_value = vStack_9e90.m_value;
      dStack_9eb8 = dStack_9e88;
      local_9ee0._0_8_ = local_9eb0._0_8_;
      local_9ee0._8_8_ = local_9eb0._8_8_;
      pMStack_9ed0 = pMStack_9ea0;
      vStack_9ec8.m_value = vStack_9e98.m_value;
      Eigen::
      Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_45,_1,_8,_45>,_1,_45,_true>_>,_0>
      ::Product((Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_8,_45,_1,_8,_45>,_1,_45,_true>_>,_0>
                 *)local_a000,
                (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                 *)local_9d80,(Rhs *)local_9ee0);
      SVar18 = Eigen::internal::dense_product_base::operator_cast_to_double
                         ((dense_product_base *)local_a000);
      pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_36,_1,_0,_36,_1>,_1> *)local_a140,
                           (ulong)uVar5);
      this_00 = local_9ef0;
      dVar14 = SVar18 + *pSVar11;
      pSVar12 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                ::operator()(local_9ef0,lVar13 * 3,col);
      col_00 = lVar17 + 1 + lVar16;
      *pSVar12 = dVar14 + *pSVar12;
      pSVar12 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                ::operator()(this_00,row,col_00);
      col_01 = lVar17 + 2 + lVar16;
      *pSVar12 = dVar14 + *pSVar12;
      pSVar12 = Eigen::
                DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                ::operator()(this_00,row_00,col_01);
      *pSVar12 = dVar14 + *pSVar12;
      if (lVar16 != 0) {
        pSVar12 = Eigen::
                  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                  ::operator()(this_00,col,lVar13 * 3);
        *pSVar12 = dVar14 + *pSVar12;
        pSVar12 = Eigen::
                  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                  ::operator()(this_00,col_00,row);
        *pSVar12 = dVar14 + *pSVar12;
        pSVar12 = Eigen::
                  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                  ::operator()(this_00,col_01,row_00);
        *pSVar12 = dVar14 + *pSVar12;
      }
      uVar5 = uVar5 + 1;
      local_a1a0 = local_a1a0 + 1;
    }
    lVar17 = lVar17 + 3;
  }
  return;
}

Assistant:

void ChElementBeamANCF_3243::ComputeInternalJacobianContIntDamping(ChMatrixRef& H,
                                                                   double Kfactor,
                                                                   double Rfactor,
                                                                   double Mfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Continuous Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // Jacobian of the generalized internal force vector is integrated across the volume of the element every time this
    // calculation is performed. For this element, this is likely more efficient than the "Pre-Integration" style
    // calculation method.

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    // No values from the generalized internal force vector are cached for reuse in the Jacobian.  Instead these
    // quantities are recalculated again during the Jacobian calculations.  This both simplifies the code and speeds
    // up the generalized internal force calculation while only having a minimal impact on the performance of the
    // Jacobian calculation speed.  The Jacobian calculation is performed in two major pieces.  First is the
    // calculation of the potentially non-symmetric and non-sparse component.  The second piece is the symmetric
    // and sparse component.

    // =============================================================================
    // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
    // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
    // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
    // Note that the indices of the components are in transposed order
    //      [F11  F21  F31  F11dot  F21dot  F31dot ] <-- D0 Block (No Poisson Effect)
    //      [F12  F22  F32  F12dot  F22dot  F32dot ] <-- D0 Block (No Poisson Effect)
    // FC = [F13  F23  F33  F13dot  F23dot  F33dot ] <-- D0 Block (No Poisson Effect)
    //      [F11  F21  F31  F11dot  F21dot  F31dot ] <-- Dv Block (With Poisson Effect)
    //      [F12  F22  F32  F12dot  F22dot  F32dot ] <-- Dv Block (With Poisson Effect)
    //      [F13  F23  F33  F13dot  F23dot  F33dot ] <-- Dv Block (With Poisson Effect)
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.transpose() * ebar_ebardot;

    //==============================================================================
    //==============================================================================
    // Calculate the potentially non-symmetric and non-sparse component of the Jacobian matrix
    //==============================================================================
    //==============================================================================

    // =============================================================================
    // Calculate the partial derivative of the Green-Largrange strains with respect to the nodal coordinates
    // (transposed).  This calculation is performed in blocks across all the Gauss quadrature points at the same
    // time.  This value should be store in row major memory layout to align with the access patterns for
    // calculating this matrix.
    // PE = [(d epsilon1/d e)GQPnt1' (d epsilon1/d e)GQPnt2' ... (d epsilon1/d e)GQPntNIP_D0'...
    //       (d epsilon2/d e)GQPnt1' (d epsilon2/d e)GQPnt2' ... (d epsilon2/d e)GQPntNIP_D0'...
    //       (d epsilon3/d e)GQPnt1' (d epsilon3/d e)GQPnt2' ... (d epsilon3/d e)GQPntNIP_D0'...
    //       (d epsilon4/d e)GQPnt1' (d epsilon4/d e)GQPnt2' ... (d epsilon4/d e)GQPntNIP_D0'...
    //       (d epsilon5/d e)GQPnt1' (d epsilon5/d e)GQPnt2' ... (d epsilon5/d e)GQPntNIP_D0'...
    //       (d epsilon6/d e)GQPnt1' (d epsilon6/d e)GQPnt2' ... (d epsilon6/d e)GQPntNIP_D0'...
    //       (d epsilon1/d e)GQPntDv1' ... (d epsilon1/d e)GQPntNIP_Dv'...
    //       (d epsilon2/d e)GQPntDv1' ... (d epsilon2/d e)GQPntNIP_Dv'...
    //       (d epsilon3/d e)GQPntDv1' ... (d epsilon3/d e)GQPntNIP_Dv']
    // Note that each partial derivative block shown is placed to the left of the previous block.
    // The explanation of the calculation above is just too long to write it all on a single line.
    // Since there are no shear terms with the material assumption for Dv, there is no need to calculate
    // (d epsilon4/d e), (d epsilon5/d e), (d epsilon6/d e) for the Dv Gauss points since these partial
    // derivatives will be multiplied by zero and will not contribute anything to the Jacobian matrix.
    // The calculation is performed on 3 rows at a time to capture the partial with respect to the vector of nodal
    // coordinates e while using the compact matrix form ebar for the calculations.
    // =============================================================================

    ChMatrixNM<double, 3 * NSF, 6 * NIP_D0 + 3 * NIP_Dv> PE;

    for (auto i = 0; i < NSF; i++) {
        PE.template block<1, NIP_D0>(3 * i, 0 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(0 * NIP_D0, 0).transpose());
        PE.template block<1, NIP_D0>(3 * i, 1 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(1 * NIP_D0, 0).transpose());
        PE.template block<1, NIP_D0>(3 * i, 2 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose());
        PE.template block<1, NIP_D0>(3 * i, 3 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(1 * NIP_D0, 0).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose());
        PE.template block<1, NIP_D0>(3 * i, 4 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(0 * NIP_D0, 0).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose());
        PE.template block<1, NIP_D0>(3 * i, 5 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(0 * NIP_D0, 0).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(1 * NIP_D0, 0).transpose());

        PE.template block<1, NIP_Dv>(3 * i, 6 * NIP_D0 + 0 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0 * NIP_Dv, 0).transpose());
        PE.template block<1, NIP_Dv>(3 * i, 6 * NIP_D0 + 1 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 1 * NIP_Dv, 0).transpose());
        PE.template block<1, NIP_Dv>(3 * i, 6 * NIP_D0 + 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0).transpose());

        PE.template block<1, NIP_D0>((3 * i) + 1, 0) =
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 1, NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 1, 2 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 1, 3 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 1, 4 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 1, 5 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1).transpose());

        PE.template block<1, NIP_Dv>((3 * i) + 1, 6 * NIP_D0 + 0) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).transpose());
        PE.template block<1, NIP_Dv>((3 * i) + 1, 6 * NIP_D0 + NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1).transpose());
        PE.template block<1, NIP_Dv>((3 * i) + 1, 6 * NIP_D0 + 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1).transpose());

        PE.template block<1, NIP_D0>((3 * i) + 2, 0) =
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 2, NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 2, 2 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 2, 3 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 2, 4 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose());
        PE.template block<1, NIP_D0>((3 * i) + 2, 5 * NIP_D0) =
            m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2).transpose()) +
            m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                .cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2).transpose());

        PE.template block<1, NIP_Dv>((3 * i) + 2, 6 * NIP_D0 + 0) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).transpose());
        PE.template block<1, NIP_Dv>((3 * i) + 2, 6 * NIP_D0 + NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2).transpose());
        PE.template block<1, NIP_Dv>((3 * i) + 2, 6 * NIP_D0 + 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2).transpose());
    }

    // =============================================================================
    // Combine the deformation gradient, time derivative of the deformation gradient, damping coefficient, Gauss
    // quadrature weighting times the element Jacobian, and Jacobian component scale factors into a scaled block
    // deformation gradient matrix Calculate the deformation gradient and time derivative of the deformation
    // gradient for all Gauss quadrature points in a single matrix multiplication.  Note that the resulting combined
    // deformation gradient block matrix will be ordered by block matrix (column vectors) components Note that the
    // indices of the components are in transposed order
    //            [kGQ*(Kfactor+alpha*Rfactor)*F11+alpha*Rfactor*F11dot ... similar for F21 & F31 blocks] <- D0
    // FCscaled = [kGQ*(Kfactor+alpha*Rfactor)*F12+alpha*Rfactor*F12dot ... similar for F22 & F32 blocks] <- D0
    //            [kGQ*(Kfactor+alpha*Rfactor)*F13+alpha*Rfactor*F13dot ... similar for F23 & F33 blocks] <- D0
    //            [kGQ*(Kfactor+alpha*Rfactor)*F11+alpha*Rfactor*F11dot ... similar for F21 & F31 blocks] <- Dv
    //            [kGQ*(Kfactor+alpha*Rfactor)*F12+alpha*Rfactor*F12dot ... similar for F22 & F32 blocks] <- Dv
    //            [kGQ*(Kfactor+alpha*Rfactor)*F13+alpha*Rfactor*F13dot ... similar for F23 & F33 blocks] <- Dv
    // =============================================================================

    ChMatrixNMc<double, 3 * NIP, 3> FCscaled = (Kfactor + m_Alpha * Rfactor) * FC.template block<3 * NIP, 3>(0, 0) +
                                               (m_Alpha * Kfactor) * FC.template block<3 * NIP, 3>(0, 3);

    for (auto i = 0; i < 3; i++) {
        FCscaled.template block<NIP_D0, 1>(0, i).array() *= m_kGQ_D0.array();
        FCscaled.template block<NIP_D0, 1>(NIP_D0, i).array() *= m_kGQ_D0.array();
        FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, i).array() *= m_kGQ_D0.array();
        FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, i).array() *= m_kGQ_Dv.array();
        FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, i).array() *= m_kGQ_Dv.array();
        FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, i).array() *= m_kGQ_Dv.array();
    }

    // =============================================================================
    // Get the diagonal terms of the 6x6 matrix (do not include the Poisson effect
    // =============================================================================
    const ChVectorN<double, 6>& D0 = GetMaterial()->Get_D0();

    // =============================================================================
    // Calculate the combination of the scaled partial derivative of the Green-Largrange strains with respect to the
    // nodal coordinates, the scaled partial derivative of the time derivative of the Green-Largrange strains with
    // respect to the nodal coordinates, the scaled partial derivative of the Green-Largrange strains with respect
    // to the time derivative of the nodal coordinates, and the other parameters to correctly integrate across the
    // volume of the element.  This calculation is performed in blocks across all the Gauss quadrature points at the
    // same time.  This value should be store in row major memory layout to align with the access patterns for
    // calculating this matrix.
    // =============================================================================
    // For the D0 Gauss quadrature points, the stiffness matrix D0 is diagonal so the scaled partial derivatives can be
    // easily multiplied by D0.  The Dv Gauss quadrature points are handled separately after this
    // =============================================================================

    ChMatrixNM<double, 3 * NSF, 6 * NIP_D0 + 3 * NIP_Dv> DScaled_Combined_PE;

    for (auto i = 0; i < NSF; i++) {
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, 0) =
            D0(0) * m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 0).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, NIP_D0) =
            D0(1) * m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 0).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, 2 * NIP_D0) =
            D0(2) * m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, 3 * NIP_D0) =
            D0(3) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 0).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, 4 * NIP_D0) =
            D0(4) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 0).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 0).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>(3 * i, 5 * NIP_D0) =
            D0(5) * (m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 0).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 0).transpose()));

        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, 0) =
            D0(0) * m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 1).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, NIP_D0) =
            D0(1) * m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 1).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, 2 * NIP_D0) =
            D0(2) * m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, 3 * NIP_D0) =
            D0(3) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 1).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, 4 * NIP_D0) =
            D0(4) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 1).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 1).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 1, 5 * NIP_D0) =
            D0(5) * (m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 1).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 1).transpose()));

        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, 0) =
            D0(0) * m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 2).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, NIP_D0) =
            D0(1) * m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 2).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, 2 * NIP_D0) =
            D0(2) * m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                        .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose());
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, 3 * NIP_D0) =
            D0(3) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 2).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, 4 * NIP_D0) =
            D0(4) * (m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 2).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(2 * NIP_D0, 2).transpose()));
        DScaled_Combined_PE.template block<1, NIP_D0>((3 * i) + 2, 5 * NIP_D0) =
            D0(5) * (m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(0, 2).transpose()) +
                     m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)
                         .cwiseProduct(FCscaled.template block<NIP_D0, 1>(NIP_D0, 2).transpose()));
    }

    // =============================================================================
    // For the Dv Gauss quadrature points, the matrix of scaled partial derivatives needs to be calculated first since
    // they will be will be combined together when multiplying by the Dv stiffness matrix (upper 3x3 block is
    // potentially non-zero)
    // =============================================================================

    ChMatrixNM<double, 3 * NSF, 3 * NIP_Dv> Scaled_Combined_PE_Dv;

    for (auto i = 0; i < NSF; i++) {
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>(3 * i, 0) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>(3 * i, NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>(3 * i, 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0).transpose());

        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 1, 0) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 1, NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 1, 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1).transpose());

        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 2, 0) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 2, NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2).transpose());
        Scaled_Combined_PE_Dv.template block<1, NIP_Dv>((3 * i) + 2, 2 * NIP_Dv) =
            m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv)
                .cwiseProduct(FCscaled.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2).transpose());
    }

    // =============================================================================
    // Get the upper 3x3 block of the stiffness tensor in 6x6 matrix that accounts for the Poisson effect.  Note that
    // with the split of the stiffness matrix and the assumed materials, the entries in the 6x6 stiffness matrix outside
    // of the upper 3x3 block are all zeros.
    // =============================================================================

    const ChMatrix33<double>& Dv = GetMaterial()->Get_Dv();

    // =============================================================================
    // For the Dv Gauss quadrature points, multiply the scaled and combined partial derivative block matrix by the
    // stiffness matrix for each individual Gauss quadrature point and place the results in th last 3*NIP_Dv columns of
    // the final scaled and combined partial derivative block matrix since the D0 Gauss quadrature point columns were
    // calculated above.
    // =============================================================================

    DScaled_Combined_PE.template block<3 * NSF, NIP_Dv>(0, 6 * NIP_D0 + 0) =
        Dv(0, 0) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 0) +
        Dv(0, 1) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, NIP_Dv) +
        Dv(0, 2) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 2 * NIP_Dv);
    DScaled_Combined_PE.template block<3 * NSF, NIP_Dv>(0, 6 * NIP_D0 + NIP_Dv) =
        Dv(1, 0) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 0) +
        Dv(1, 1) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, NIP_Dv) +
        Dv(1, 2) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 2 * NIP_Dv);
    DScaled_Combined_PE.template block<3 * NSF, NIP_Dv>(0, 6 * NIP_D0 + 2 * NIP_Dv) =
        Dv(2, 0) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 0) +
        Dv(2, 1) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, NIP_Dv) +
        Dv(2, 2) * Scaled_Combined_PE_Dv.template block<3 * NSF, NIP_Dv>(0, 2 * NIP_Dv);

    // =============================================================================
    // Multiply the partial derivative block matrix by the final scaled and combined partial derivative block matrix
    // to obtain the potentially non-symmetric and non-sparse component of the Jacobian matrix
    // =============================================================================

    H = PE * DScaled_Combined_PE.transpose();

    //==============================================================================
    //==============================================================================
    // Calculate the sparse and symmetric component of the Jacobian matrix
    //==============================================================================
    //==============================================================================

    // =============================================================================
    // Calculate each individual value of the Green-Lagrange strain component by component across all the
    // Gauss-Quadrature points at a time to better leverage vectorized CPU instructions.
    // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
    // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
    // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
    // =============================================================================
    // For the D0 Gauss quadrature points:
    // Since only the diagonal terms in the 6x6 stiffness matrix are used, the 2nd Piola-Kirchoff stress can be
    // calculated by simply scaling the vector of scaled Green-Lagrange strains in Voight notation by the corresponding
    // diagonal entry in the stiffness matrix.
    // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    // =============================================================================

    // Each entry in SPK2_1 = D11*kGQ*(E11+alpha*E11dot)
    //     = D11*kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP_D0 E_BlockDamping_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5));
    VectorNIP_D0 SPK2_1_Block_D0 = FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 0)) +
                                   FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 1)) +
                                   FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 2));
    SPK2_1_Block_D0.array() -= 1;
    SPK2_1_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_1_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_1_Block_D0 *= (0.5 * D0(0));

    // Each entry in SPK2_2 = D22*kGQ*(E22+alpha*E22dot)
    //     = D22*kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5));
    VectorNIP_D0 SPK2_2_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_2_Block_D0.array() -= 1;
    SPK2_2_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_2_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_2_Block_D0 *= (0.5 * D0(1));

    // Each entry in SPK2_3 = D33*kGQ*(E33+alpha*E33dot)
    //     = D33*kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_3_Block_D0 =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_3_Block_D0.array() -= 1;
    SPK2_3_Block_D0 += (2 * m_Alpha) * E_BlockDamping_D0;
    SPK2_3_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_3_Block_D0 *= (0.5 * D0(2));

    // Each entry in SPK2_4 = D44*kGQ*(2*(E23+alpha*E23dot))
    //     = D44*kGQ*((F12*F13+F22*F23+F32*F33)
    //       +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_4_Block_D0 =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_4_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_4_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_4_Block_D0 *= D0(3);

    // Each entry in SPK2_5 = D55*kGQ*(2*(E13+alpha*E13dot))
    //     = D55*kGQ*((F11*F13+F21*F23+F31*F33)
    //       +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(2 * NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5)) +
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 5));
    VectorNIP_D0 SPK2_5_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(2 * NIP_D0, 2));
    SPK2_5_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_5_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_5_Block_D0 *= D0(4);

    // Each entry in SPK2_6 = D66*kGQ*(2*(E12+alpha*E12dot))
    //     = D66*kGQ*((F11*F12+F21*F22+F31*F32)
    //       +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
    E_BlockDamping_D0.noalias() =
        FC.template block<NIP_D0, 1>(NIP_D0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(0, 3)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(0, 4)) +
        FC.template block<NIP_D0, 1>(NIP_D0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(0, 5)) +
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 3)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 4)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 5));
    VectorNIP_D0 SPK2_6_Block_D0 =
        FC.template block<NIP_D0, 1>(0, 0).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 0)) +
        FC.template block<NIP_D0, 1>(0, 1).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 1)) +
        FC.template block<NIP_D0, 1>(0, 2).cwiseProduct(FC.template block<NIP_D0, 1>(NIP_D0, 2));
    SPK2_6_Block_D0 += m_Alpha * E_BlockDamping_D0;
    SPK2_6_Block_D0.array() *= m_kGQ_D0.array();
    SPK2_6_Block_D0 *= D0(5);

    // =============================================================================
    // For the Dv Gauss quadrature points:
    // Since only the upper 3x3 terms in the 6x6 stiffness matrix are used, only the E11, E22, and E33 components of the
    // Green-Lagrange strain tensor (combined and scaled) are needed since multiplying by the Dv stiffness matrix will
    // result in 2nd Piola-Kirchoff stresses that are only possibly non-zero for SPK2_11, SPK2_22, and SPK2_33. Results
    // are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
    // =============================================================================

    // Each entry in E1 = kGQ*(E11+alpha*E11dot)
    //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
    VectorNIP_Dv E_BlockDamping_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 3)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 4)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 5));
    VectorNIP_Dv E1_Block_Dv =
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 0)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 1)) +
        FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2).cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 0, 2));
    E1_Block_Dv.array() -= 1;
    E1_Block_Dv *= 0.5;
    E1_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E1_Block_Dv.array() *= m_kGQ_Dv.array();

    // Each entry in E2 = kGQ*(E22+alpha*E22dot)
    //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
    E_BlockDamping_Dv.noalias() = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 3)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 4)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 5));
    VectorNIP_Dv E2_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + NIP_Dv, 2));
    E2_Block_Dv.array() -= 1;
    E2_Block_Dv *= 0.5;
    E2_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E2_Block_Dv.array() *= m_kGQ_Dv.array();

    // Each entry in E3 = kGQ*(E33+alpha*E33dot)
    //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
    E_BlockDamping_Dv.noalias() = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 3)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 4)) +
                                  FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                      .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 5));
    VectorNIP_Dv E3_Block_Dv = FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 0)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 1)) +
                               FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2)
                                   .cwiseProduct(FC.template block<NIP_Dv, 1>(3 * NIP_D0 + 2 * NIP_Dv, 2));
    E3_Block_Dv.array() -= 1;
    E3_Block_Dv *= 0.5;
    E3_Block_Dv += m_Alpha * E_BlockDamping_Dv;
    E3_Block_Dv.array() *= m_kGQ_Dv.array();

    // =============================================================================
    // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Dv Gauss quadrature points.
    // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
    // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
    // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
    //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
    //  where SPK2_23, SPK2_13, and SPK2_12 are zeros for the Dv Gauss quadrature points
    // =============================================================================

    VectorNIP_Dv SPK2_1_Block_Dv = Dv(0, 0) * E1_Block_Dv + Dv(0, 1) * E2_Block_Dv + Dv(0, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_2_Block_Dv = Dv(1, 0) * E1_Block_Dv + Dv(1, 1) * E2_Block_Dv + Dv(1, 2) * E3_Block_Dv;
    VectorNIP_Dv SPK2_3_Block_Dv = Dv(2, 0) * E1_Block_Dv + Dv(2, 1) * E2_Block_Dv + Dv(2, 2) * E3_Block_Dv;

    // =============================================================================
    // Multiply the shape function derivative matrix by the 2nd Piola-Kirchoff stresses for each corresponding Gauss
    // quadrature point
    // =============================================================================

    ChMatrixNM<double, NSF, 3 * NIP> S_scaled_SD;

    for (auto i = 0; i < NSF; i++) {
        S_scaled_SD.template block<1, NIP_D0>(i, 0) =
            SPK2_1_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)) +
            SPK2_6_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)) +
            SPK2_5_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0));

        S_scaled_SD.template block<1, NIP_D0>(i, NIP_D0) =
            SPK2_6_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)) +
            SPK2_2_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)) +
            SPK2_4_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0));

        S_scaled_SD.template block<1, NIP_D0>(i, 2 * NIP_D0) =
            SPK2_5_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 0 * NIP_D0)) +
            SPK2_4_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 1 * NIP_D0)) +
            SPK2_3_Block_D0.transpose().cwiseProduct(m_SD.template block<1, NIP_D0>(i, 2 * NIP_D0));

        S_scaled_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0) =
            SPK2_1_Block_Dv.transpose().cwiseProduct(m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 0 * NIP_Dv));

        S_scaled_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + NIP_Dv) =
            SPK2_2_Block_Dv.transpose().cwiseProduct(m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 1 * NIP_Dv));

        S_scaled_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv) =
            SPK2_3_Block_Dv.transpose().cwiseProduct(m_SD.template block<1, NIP_Dv>(i, 3 * NIP_D0 + 2 * NIP_Dv));
    }

    // =============================================================================
    // Calculate just the non-sparse upper triangular entires of the sparse and symmetric component of the Jacobian
    // matrix, combine this with the scaled mass matrix, and then expand them out to full size by summing the
    // contribution into the correct locations of the full sized Jacobian matrix
    // =============================================================================

    // Add in the Mass Matrix Which is Stored in Compact Upper Triangular Form
    ChVectorN<double, (NSF * (NSF + 1)) / 2> ScaledMassMatrix = Mfactor * m_MassMatrix;

    unsigned int idx = 0;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = i; j < NSF; j++) {
            double d = Kfactor * m_SD.row(i) * S_scaled_SD.row(j).transpose();
            d += ScaledMassMatrix(idx);

            H(3 * i, 3 * j) += d;
            H(3 * i + 1, 3 * j + 1) += d;
            H(3 * i + 2, 3 * j + 2) += d;
            if (i != j) {
                H(3 * j, 3 * i) += d;
                H(3 * j + 1, 3 * i + 1) += d;
                H(3 * j + 2, 3 * i + 2) += d;
            }
            idx++;
        }
    }
}